

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  int iVar4;
  BBox1f BVar5;
  PrimRefVector pmVar6;
  FastAllocator *pFVar7;
  ThreadLocal2 *pTVar8;
  iterator iVar9;
  _func_int **pp_Var10;
  PrimRefMB *pPVar11;
  Ref<embree::Geometry> *pRVar12;
  Geometry *pGVar13;
  long lVar14;
  uint uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  BBox1f BVar21;
  char cVar22;
  vfloat_impl<4> *this_00;
  Device *pDVar23;
  pointer pcVar24;
  void *pvVar25;
  ulong uVar26;
  undefined8 *puVar27;
  runtime_error *prVar28;
  long lVar29;
  Device *pDVar30;
  size_t sVar31;
  ulong uVar32;
  float *pfVar33;
  BBox1f *pBVar34;
  ulong uVar35;
  char *pcVar36;
  char *pcVar37;
  ulong uVar38;
  long lVar39;
  BuildRecord *in_00;
  long lVar40;
  uint uVar41;
  undefined8 uVar42;
  ulong uVar43;
  long lVar44;
  long *plVar45;
  long lVar46;
  long lVar47;
  code *pcVar48;
  BBox1f BVar49;
  mvector<PrimRefMB> *prims;
  Device *pDVar50;
  ulong uVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  float fVar54;
  size_type sVar55;
  float fVar57;
  size_type sVar58;
  undefined1 auVar56 [16];
  float fVar59;
  float fVar60;
  float fVar64;
  float fVar65;
  undefined1 auVar61 [16];
  float fVar66;
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  float fVar71;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar79;
  float fVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar85;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar99;
  float fVar100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *pBVar108;
  undefined1 local_1ee0 [8];
  undefined1 local_1ed8 [8];
  undefined8 uStack_1ed0;
  undefined1 local_1ec8 [24];
  _Alloc_hider local_1eb0;
  undefined1 local_1ea8 [16];
  undefined1 local_1e98 [8];
  _Alloc_hider _Stack_1e90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e88;
  undefined1 local_1e78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e60;
  _Alloc_hider local_1e50;
  BBox1f time_range1;
  BBox1f time_range0;
  float local_1e28;
  float fStack_1e24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e20 [2];
  PrimRefVector lprims;
  Vec3vf<4> vc1;
  Vec3vf<4> vb1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d38;
  undefined1 local_1d28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d18;
  undefined1 local_1d08 [24];
  _Alloc_hider _Stack_1cf0;
  undefined1 local_1ce8 [16];
  Vec3vf<4> vc0;
  undefined1 local_1ca8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c98;
  undefined1 local_1c88 [24];
  _Alloc_hider _Stack_1c70;
  undefined1 local_1c68 [16];
  __atomic_base<unsigned_long> local_1c58;
  _Alloc_hider _Stack_1c50;
  undefined1 local_1c48 [8];
  undefined1 auStack_1c40 [24];
  undefined1 local_1c28 [32];
  undefined1 local_1c08 [24];
  _Alloc_hider _Stack_1bf0;
  anon_class_1_0_00000001 reduction;
  Vec3vf<4> va1;
  undefined8 local_1b98;
  undefined1 auStack_1b90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b48;
  BBox1f local_1b38;
  undefined1 auStack_1b30 [24];
  _Alloc_hider local_1b18;
  undefined1 auStack_1b10 [24];
  _Alloc_hider local_1af8;
  undefined1 auStack_1af0 [24];
  undefined8 local_1ad8;
  undefined1 auStack_1ad0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ac8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1a38 [16];
  vuint<4> vgeomID;
  vuint<4> vprimID;
  BuildRecordSplit current;
  float fStack_17d4;
  undefined4 uStack_17d0;
  undefined4 uStack_17cc;
  Vec3vf<4> va0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1768;
  BBox1f local_1758 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748;
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1728;
  atomic<embree::FastAllocator::Block_*> local_1718;
  undefined8 uStack_1710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1708;
  _Alloc_hider local_16f8;
  size_type sStack_16f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16e8 [226];
  FastAllocator *local_8c8 [16];
  Device *local_848;
  undefined1 local_840 [520];
  NodeRecordMB4D values [16];
  
  uVar38 = in->depth;
  local_1e60._M_allocated_capacity = (size_type)__return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar38) {
    puVar27 = (undefined8 *)__cxa_allocate_exception(0x30);
    va0.field_0._0_8_ = (long)&va0.field_0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&va0,"depth limit reached","");
    *puVar27 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar27 + 1) = 1;
    puVar27[2] = puVar27 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar27 + 2),va0.field_0._0_8_,va0.field_0._8_8_ + va0.field_0._0_8_);
    __cxa_throw(puVar27,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  _local_1e98 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128;
  local_1e78._0_16_ =
       *(undefined1 (*) [16])
        (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
        bounds0.upper.field_0.m128;
  _local_1ed8 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.lower.field_0.m128;
  local_1ec8._0_16_ =
       *(undefined1 (*) [16])
        (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
        bounds1.upper.field_0.m128;
  local_1ea8._0_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
         lower.field_0;
  local_1ea8._8_8_ =
       *(size_type *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0 + 8);
  uVar16 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar17 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  BVar49 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar5 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  pmVar6 = (in->prims).prims;
  uVar42 = &va0;
  local_1ac8._M_allocated_capacity = (size_type)in;
  findFallback((Split *)uVar42,this,&in->prims);
  local_16e8[0]._8_8_ = local_1798._8_8_;
  local_16e8[0]._0_8_ = local_1798._0_8_;
  sStack_16f0 = va0.field_0._40_8_;
  local_16f8._M_p = (pointer)va0.field_0._32_8_;
  local_1708._M_allocated_capacity = va0.field_0._16_8_;
  local_1e28 = (float)uVar16;
  fStack_1e24 = (float)((ulong)uVar16 >> 0x20);
  aaStack_1e20[0]._M_allocated_capacity._0_4_ = (undefined4)uVar17;
  aaStack_1e20[0]._M_allocated_capacity._4_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._0_8_ = local_1e98;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._8_8_ = _Stack_1e90._M_p;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = local_1e78._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = local_1e78._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._0_8_ = local_1ed8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._8_8_ = uStack_1ed0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._0_8_ = local_1ec8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._8_8_ = local_1ec8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._0_8_ = local_1ea8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._8_8_ = local_1ea8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0.m128[0] = local_1e28;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0.m128[1] = fStack_1e24;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0.m128[2] = (float)aaStack_1e20[0]._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0.m128[3] = (float)aaStack_1e20[0]._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar21 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)va0.field_0._0_4_;
  current.split.dim = va0.field_0._4_4_;
  current.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)va0.field_0._8_4_;
  current.split.data = va0.field_0._12_4_;
  uVar16 = current.split._8_8_;
  current.split.mapping.num = va0.field_0._16_8_;
  current.split.mapping.ofs.field_0._0_8_ = va0.field_0._32_8_;
  current.split.mapping.ofs.field_0._8_8_ = va0.field_0._40_8_;
  current.split.mapping.scale.field_0._0_8_ = local_1798._0_8_;
  current.split.mapping.scale.field_0._8_8_ = local_1798._8_8_;
  uVar51 = (long)BVar5 - (long)BVar49;
  if (uVar51 == 0 || uVar38 != 1) {
    bVar18 = false;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar29 = (long)BVar5 - (long)BVar49;
    if ((ulong)BVar5 < (ulong)BVar49 || lVar29 == 0) {
      auVar73._0_12_ = ZEXT812(0x7f800000);
      auVar73._12_4_ = 0;
      fVar95 = -INFINITY;
    }
    else {
      pfVar33 = &pmVar6->items[(long)BVar49].time_range.upper;
      auVar73._0_12_ = ZEXT812(0x7f800000);
      auVar73._12_4_ = 0;
      fVar89 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar33 + -1))->lower <= auVar73._0_4_) {
          auVar73._0_4_ = ((BBox1f *)(pfVar33 + -1))->lower;
        }
        fVar95 = *pfVar33;
        if (*pfVar33 <= fVar89) {
          fVar95 = fVar89;
        }
        pfVar33 = pfVar33 + 0x14;
        lVar29 = lVar29 + -1;
        fVar89 = fVar95;
      } while (lVar29 != 0);
    }
    bVar18 = fVar95 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper ||
             current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < auVar73._0_4_;
  }
  current.super_BuildRecord.depth = uVar38;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)BVar49;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)BVar5;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar21;
  current.super_BuildRecord.prims.prims = pmVar6;
  current.split._8_8_ = uVar16;
  if (((uVar51 <= (this->cfg).maxLeafSize) &&
      (current.split.data = (uint)((ulong)va0.field_0._8_8_ >> 0x20), current.split.data < 2)) &&
     (!bVar18)) {
    uVar38 = uVar51 + 3 >> 2;
    va1.field_0._0_8_ = uVar38 * 0x140;
    pTVar8 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      va0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      va0.field_0._8_1_ = 1;
      vc0.field_0._0_8_ = pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&vc0);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)vc0.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar42 = va1.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + va1.field_0._0_8_;
    sVar31 = (alloc.talloc1)->cur;
    uVar26 = (ulong)(-(int)sVar31 & 0xf);
    uVar43 = sVar31 + va1.field_0._0_8_ + uVar26;
    (alloc.talloc1)->cur = uVar43;
    if ((alloc.talloc1)->end < uVar43) {
      (alloc.talloc1)->cur = sVar31;
      uVar43 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(va1.field_0._0_8_ * 4) < uVar43 || va1.field_0._0_8_ * 4 - uVar43 == 0) {
        va0.field_0._0_8_ = uVar43;
        pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va0);
        (alloc.talloc1)->ptr = pcVar37;
        sVar31 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar31;
        (alloc.talloc1)->end = va0.field_0._0_8_;
        (alloc.talloc1)->cur = uVar42;
        if ((ulong)va0.field_0._0_8_ < (ulong)uVar42) {
          (alloc.talloc1)->cur = 0;
          va0.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va0);
          (alloc.talloc1)->ptr = pcVar37;
          sVar31 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar31;
          (alloc.talloc1)->end = va0.field_0._0_8_;
          (alloc.talloc1)->cur = uVar42;
          if ((ulong)va0.field_0._0_8_ < (ulong)uVar42) {
            (alloc.talloc1)->cur = 0;
            pcVar37 = (char *)0x0;
            goto LAB_00c50e18;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar31;
      }
      else {
        pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar26;
      pcVar37 = (alloc.talloc1)->ptr + (uVar43 - va1.field_0._0_8_);
    }
LAB_00c50e18:
    uVar43 = 7;
    if (uVar38 < 7) {
      uVar43 = uVar38;
    }
    aVar75 = _DAT_01f7aa00;
    aVar79 = _DAT_01f7aa00;
    aVar85 = _DAT_01f7a9f0;
    aVar93 = _DAT_01f7a9f0;
    if (3 < uVar51 + 3) {
      lVar29 = 0;
      aVar63 = _DAT_01f7a9f0;
      aVar68 = _DAT_01f7aa00;
      pBVar108 = this;
      do {
        uVar19 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
        pPVar11 = (current.super_BuildRecord.prims.prims)->items;
        fVar95 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        fVar89 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        vgeomID.field_0.v[0] = -1;
        vgeomID.field_0.v[1] = -1;
        vprimID.field_0.v[0] = -1;
        vprimID.field_0.v[1] = -1;
        va0.field_0._32_8_ = 0;
        va0.field_0._40_8_ = 0;
        va0.field_0._16_8_ = 0;
        va0.field_0._24_8_ = 0;
        va0.field_0._0_8_ = 0;
        va0.field_0._8_8_ = 0;
        values[0].lbounds.bounds0.upper.field_0._0_8_ = 0;
        values[0].lbounds.bounds0.upper.field_0._8_8_ = 0;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = 0;
        values[0].lbounds.bounds0.lower.field_0._8_8_ = 0;
        values[0].ref.ptr = 0;
        values[0]._8_8_ = 0;
        vc0.field_0._32_4_ = 0;
        vc0.field_0._36_4_ = 0;
        vc0.field_0._40_4_ = 0;
        vc0.field_0._44_4_ = 0;
        vc0.field_0._16_4_ = 0;
        vc0.field_0._20_4_ = 0;
        vc0.field_0._24_4_ = 0;
        vc0.field_0._28_4_ = 0;
        vc0.field_0._0_8_ = 0;
        vc0.field_0._8_8_ = 0;
        va1.field_0._32_8_ = 0;
        va1.field_0._40_8_ = 0;
        va1.field_0._16_8_ = 0;
        va1.field_0._24_8_ = 0;
        va1.field_0._0_8_ = 0;
        va1.field_0._8_8_ = 0;
        vb1.field_0._32_8_ = 0;
        vb1.field_0._40_8_ = 0;
        vb1.field_0._16_8_ = 0;
        vb1.field_0._24_8_ = 0;
        vb1.field_0._0_8_ = 0;
        vb1.field_0._8_8_ = 0;
        vc1.field_0._32_8_ = 0;
        vc1.field_0._40_8_ = 0;
        vc1.field_0._16_8_ = 0;
        vc1.field_0._24_8_ = 0;
        vc1.field_0._0_8_ = 0;
        vc1.field_0._8_8_ = 0;
        aVar98 = aVar63;
        local_1ab8 = aVar68;
        aVar105 = aVar63;
        local_1e88 = aVar68;
        if ((ulong)BVar49 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
          pRVar12 = (((this->createLeaf).bvh)->scene->geometries).items;
          uVar51 = 0;
          fStack_17d4 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
          uStack_17d0 = 0;
          uStack_17cc = 0;
          this = pBVar108;
          do {
            fVar94 = pPVar11[(long)BVar49].lbounds.bounds0.lower.field_0.m128[3];
            pcVar24 = (pointer)(ulong)(uint)pPVar11[(long)BVar49].lbounds.bounds0.upper.field_0.m128
                                            [3];
            pGVar13 = pRVar12[(uint)fVar94].ptr;
            local_1e78._0_8_ = pGVar13->time_range;
            local_1e78._8_8_ = 0;
            local_1ea8 = ZEXT416((uint)pGVar13->fnumTimeSegments);
            fVar101 = SUB84(local_1e78._0_8_,4);
            local_1ed8._0_4_ = fVar101 - (float)local_1e78._0_8_;
            local_1ed8._4_4_ = fVar101 - fVar101;
            uStack_1ed0._0_4_ = fVar101 - 0.0;
            uStack_1ed0._4_4_ = fVar101 - 0.0;
            local_1e98._0_4_ = (fVar95 - (float)local_1e78._0_8_) / (float)local_1ed8._0_4_;
            local_1e98._4_4_ = fStack_17d4;
            _Stack_1e90._M_p._0_4_ = uStack_17d0;
            _Stack_1e90._M_p._4_4_ = uStack_17cc;
            fVar99 = floorf((float)local_1e98._0_4_ * 1.0000002 * pGVar13->fnumTimeSegments);
            fVar101 = 0.0;
            if (0.0 <= fVar99) {
              fVar101 = fVar99;
            }
            local_1e60._8_4_ = (int)fVar101;
            lVar47 = *(long *)&pGVar13->field_0x58;
            lVar40 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (long)pcVar24;
            local_1ad8._0_4_ = (fVar89 - (float)local_1e78._0_4_) / (float)local_1ed8._0_4_;
            local_1ac8._M_allocated_capacity._4_4_ = local_1ea8._4_4_;
            local_1ac8._M_allocated_capacity._0_4_ =
                 (float)local_1ea8._0_4_ * (float)local_1e98._0_4_;
            local_1ac8._8_4_ = local_1ea8._8_4_;
            local_1ac8._12_4_ = local_1ea8._12_4_;
            local_1ad8._4_4_ = fVar89;
            auStack_1ad0._0_4_ = fVar89;
            auStack_1ad0._4_4_ = fVar89;
            local_1ec8._4_4_ = local_1ea8._4_4_;
            local_1ec8._0_4_ = (float)local_1ea8._0_4_ * (float)local_1ad8;
            local_1ec8._8_4_ = local_1ea8._8_4_;
            local_1ec8._12_4_ = local_1ea8._12_4_;
            local_1e50._M_p = pcVar24;
            fVar101 = floorf((float)local_1ea8._0_4_ * (float)local_1e98._0_4_);
            local_1eb0._M_p._0_4_ = fVar101;
            fVar99 = ceilf((float)local_1ec8._0_4_);
            fVar101 = local_1eb0._M_p._0_4_;
            if (local_1eb0._M_p._0_4_ <= 0.0) {
              fVar101 = 0.0;
            }
            fVar100 = fVar99;
            if ((float)local_1ea8._0_4_ <= fVar99) {
              fVar100 = (float)local_1ea8._0_4_;
            }
            iVar4 = (int)local_1eb0._M_p._0_4_;
            if ((int)local_1eb0._M_p._0_4_ < 0) {
              iVar4 = -1;
            }
            uVar15 = (int)(float)local_1ea8._0_4_ + 1U;
            if ((int)fVar99 < (int)((int)(float)local_1ea8._0_4_ + 1U)) {
              uVar15 = (int)fVar99;
            }
            uVar35 = (ulong)*(uint *)(lVar47 + lVar40);
            uVar32 = (ulong)*(uint *)(lVar47 + 4 + lVar40);
            lVar14 = *(long *)&pGVar13[2].numPrimitives;
            lVar44 = (long)(int)fVar101 * 0x38;
            lVar46 = *(long *)(lVar14 + lVar44);
            lVar39 = *(long *)(lVar14 + 0x10 + lVar44);
            auVar73 = *(undefined1 (*) [16])(lVar46 + lVar39 * uVar35);
            auVar84 = *(undefined1 (*) [16])(lVar46 + lVar39 * uVar32);
            uVar26 = (ulong)*(uint *)(lVar47 + 8 + lVar40);
            auVar88 = *(undefined1 (*) [16])(lVar46 + lVar39 * uVar26);
            auVar91 = minps(auVar73,auVar84);
            auVar91 = minps(auVar91,auVar88);
            auVar73 = maxps(auVar73,auVar84);
            auVar97 = maxps(auVar73,auVar88);
            lVar46 = (long)(int)fVar100 * 0x38;
            lVar47 = *(long *)(lVar14 + lVar46);
            lVar40 = *(long *)(lVar14 + 0x10 + lVar46);
            auVar73 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar35);
            auVar84 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar32);
            auVar88 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar26);
            auVar107 = minps(auVar73,auVar84);
            auVar107 = minps(auVar107,auVar88);
            auVar73 = maxps(auVar73,auVar84);
            auVar73 = maxps(auVar73,auVar88);
            fVar101 = (float)local_1ac8._M_allocated_capacity._0_4_ - fVar101;
            fVar65 = auVar107._0_4_;
            fVar99 = auVar91._0_4_;
            fVar76 = auVar73._0_4_;
            fVar80 = auVar73._4_4_;
            fVar81 = auVar73._8_4_;
            fVar82 = auVar73._12_4_;
            fVar71 = auVar97._0_4_;
            fVar72 = auVar97._4_4_;
            fVar57 = auVar97._8_4_;
            fVar86 = auVar97._12_4_;
            fVar102 = auVar91._4_4_;
            fVar103 = auVar91._8_4_;
            fVar64 = auVar91._12_4_;
            fVar66 = auVar107._4_4_;
            fVar69 = auVar107._8_4_;
            fVar70 = auVar107._12_4_;
            if (uVar15 - iVar4 == 1) {
              if (fVar101 <= 0.0) {
                fVar101 = 0.0;
              }
              fVar59 = 1.0 - fVar101;
              auVar53._4_4_ = fVar59 * fVar102 + fVar101 * fVar66;
              auVar53._0_4_ = fVar59 * fVar99 + fVar101 * fVar65;
              auVar61._0_4_ = fVar59 * fVar71 + fVar101 * fVar76;
              auVar61._4_4_ = fVar59 * fVar72 + fVar101 * fVar80;
              auVar61._8_4_ = fVar59 * fVar57 + fVar101 * fVar81;
              auVar61._12_4_ = fVar59 * fVar86 + fVar101 * fVar82;
              fVar54 = fVar100 - (float)local_1ec8._0_4_;
              if (fVar100 - (float)local_1ec8._0_4_ <= 0.0) {
                fVar54 = 0.0;
              }
              fVar100 = 1.0 - fVar54;
              auVar56._0_4_ = fVar65 * fVar100 + fVar99 * fVar54;
              auVar56._4_4_ = fVar66 * fVar100 + fVar102 * fVar54;
              auVar56._8_4_ = fVar69 * fVar100 + fVar103 * fVar54;
              auVar56._12_4_ = fVar70 * fVar100 + fVar64 * fVar54;
              auVar67._0_4_ = fVar100 * fVar76 + fVar54 * fVar71;
              auVar67._4_4_ = fVar100 * fVar80 + fVar54 * fVar72;
              auVar67._8_4_ = fVar100 * fVar81 + fVar54 * fVar57;
              auVar67._12_4_ = fVar100 * fVar82 + fVar54 * fVar86;
              auVar53._8_4_ = fVar59 * fVar103 + fVar101 * fVar69;
              auVar53._12_4_ = fVar59 * fVar64 + fVar101 * fVar70;
            }
            else {
              lVar47 = *(long *)(lVar44 + lVar14 + 0x38);
              lVar40 = *(long *)(lVar44 + lVar14 + 0x48);
              auVar73 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar35);
              auVar84 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar32);
              auVar88 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar26);
              auVar91 = minps(auVar73,auVar84);
              auVar97 = minps(auVar91,auVar88);
              auVar73 = maxps(auVar73,auVar84);
              auVar91 = maxps(auVar73,auVar88);
              lVar47 = *(long *)(lVar46 + lVar14 + -0x38);
              lVar40 = *(long *)(lVar46 + lVar14 + -0x28);
              auVar73 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar35);
              auVar84 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar32);
              auVar88 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar26);
              auVar107 = minps(auVar73,auVar84);
              auVar107 = minps(auVar107,auVar88);
              auVar73 = maxps(auVar73,auVar84);
              auVar73 = maxps(auVar73,auVar88);
              if (fVar101 <= 0.0) {
                fVar101 = 0.0;
              }
              fVar54 = 1.0 - fVar101;
              auVar53._0_4_ = fVar99 * fVar54 + auVar97._0_4_ * fVar101;
              auVar53._4_4_ = fVar102 * fVar54 + auVar97._4_4_ * fVar101;
              auVar53._8_4_ = fVar103 * fVar54 + auVar97._8_4_ * fVar101;
              auVar53._12_4_ = fVar64 * fVar54 + auVar97._12_4_ * fVar101;
              auVar61._0_4_ = fVar54 * fVar71 + fVar101 * auVar91._0_4_;
              auVar61._4_4_ = fVar54 * fVar72 + fVar101 * auVar91._4_4_;
              auVar61._8_4_ = fVar54 * fVar57 + fVar101 * auVar91._8_4_;
              auVar61._12_4_ = fVar54 * fVar86 + fVar101 * auVar91._12_4_;
              fVar101 = fVar100 - (float)local_1ec8._0_4_;
              if (fVar100 - (float)local_1ec8._0_4_ <= 0.0) {
                fVar101 = 0.0;
              }
              fVar99 = 1.0 - fVar101;
              auVar56._0_4_ = fVar65 * fVar99 + auVar107._0_4_ * fVar101;
              auVar56._4_4_ = fVar66 * fVar99 + auVar107._4_4_ * fVar101;
              auVar56._8_4_ = fVar69 * fVar99 + auVar107._8_4_ * fVar101;
              auVar56._12_4_ = fVar70 * fVar99 + auVar107._12_4_ * fVar101;
              auVar67._0_4_ = fVar99 * fVar76 + fVar101 * auVar73._0_4_;
              auVar67._4_4_ = fVar99 * fVar80 + fVar101 * auVar73._4_4_;
              auVar67._8_4_ = fVar99 * fVar81 + fVar101 * auVar73._8_4_;
              auVar67._12_4_ = fVar99 * fVar82 + fVar101 * auVar73._12_4_;
              uVar41 = iVar4 + 1;
              if ((int)uVar41 < (int)uVar15) {
                plVar45 = (long *)((ulong)uVar41 * 0x38 + lVar14 + 0x10);
                do {
                  fVar72 = ((float)(int)uVar41 / (float)local_1ea8._0_4_ - (float)local_1e98._0_4_)
                           / ((float)local_1ad8 - (float)local_1e98._0_4_);
                  fVar101 = 1.0 - fVar72;
                  fVar102 = auVar56._4_4_;
                  fVar103 = auVar56._12_4_;
                  fVar57 = auVar56._8_4_;
                  fVar99 = auVar53._4_4_;
                  fVar100 = auVar53._12_4_;
                  fVar86 = auVar53._8_4_;
                  fVar69 = auVar67._4_4_;
                  fVar70 = auVar67._8_4_;
                  fVar71 = auVar67._12_4_;
                  fVar64 = auVar61._4_4_;
                  fVar65 = auVar61._8_4_;
                  fVar66 = auVar61._12_4_;
                  lVar47 = plVar45[-2];
                  lVar40 = *plVar45;
                  auVar73 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar35);
                  auVar84 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar32);
                  auVar88 = *(undefined1 (*) [16])(lVar47 + lVar40 * uVar26);
                  auVar91 = minps(auVar73,auVar84);
                  auVar91 = minps(auVar91,auVar88);
                  auVar92._0_4_ = auVar91._0_4_ - (auVar53._0_4_ * fVar101 + auVar56._0_4_ * fVar72)
                  ;
                  auVar92._4_4_ = auVar91._4_4_ - (fVar99 * fVar101 + fVar102 * fVar72);
                  auVar92._8_4_ = auVar91._8_4_ - (fVar86 * fVar101 + fVar57 * fVar72);
                  auVar92._12_4_ = auVar91._12_4_ - (fVar100 * fVar101 + fVar103 * fVar72);
                  auVar73 = maxps(auVar73,auVar84);
                  auVar73 = maxps(auVar73,auVar88);
                  auVar74._0_4_ = auVar73._0_4_ - (fVar101 * auVar61._0_4_ + fVar72 * auVar67._0_4_)
                  ;
                  auVar74._4_4_ = auVar73._4_4_ - (fVar101 * fVar64 + fVar72 * fVar69);
                  auVar74._8_4_ = auVar73._8_4_ - (fVar101 * fVar65 + fVar72 * fVar70);
                  auVar74._12_4_ = auVar73._12_4_ - (fVar101 * fVar66 + fVar72 * fVar71);
                  auVar84 = minps(auVar92,ZEXT816(0));
                  auVar73 = maxps(auVar74,ZEXT816(0));
                  auVar53._0_4_ = auVar53._0_4_ + auVar84._0_4_;
                  auVar53._4_4_ = fVar99 + auVar84._4_4_;
                  auVar53._8_4_ = fVar86 + auVar84._8_4_;
                  auVar53._12_4_ = fVar100 + auVar84._12_4_;
                  auVar56._0_4_ = auVar56._0_4_ + auVar84._0_4_;
                  auVar56._4_4_ = fVar102 + auVar84._4_4_;
                  auVar56._8_4_ = fVar57 + auVar84._8_4_;
                  auVar56._12_4_ = fVar103 + auVar84._12_4_;
                  auVar61._0_4_ = auVar61._0_4_ + auVar73._0_4_;
                  auVar61._4_4_ = fVar64 + auVar73._4_4_;
                  auVar61._8_4_ = fVar65 + auVar73._8_4_;
                  auVar61._12_4_ = fVar66 + auVar73._12_4_;
                  auVar67._0_4_ = auVar67._0_4_ + auVar73._0_4_;
                  auVar67._4_4_ = fVar69 + auVar73._4_4_;
                  auVar67._8_4_ = fVar70 + auVar73._8_4_;
                  auVar67._12_4_ = fVar71 + auVar73._12_4_;
                  uVar41 = uVar41 + 1;
                  plVar45 = plVar45 + 7;
                } while (uVar15 != uVar41);
              }
            }
            local_1e88.m128 = (__m128)maxps(local_1e88.m128,auVar67);
            aVar105.m128 = (__m128)minps(aVar105.m128,auVar56);
            local_1ab8.m128 = (__m128)maxps(local_1ab8.m128,auVar61);
            aVar98.m128 = (__m128)minps(aVar98.m128,auVar53);
            lVar47 = *(long *)(lVar14 + (long)(int)local_1e60._8_4_ * 0x38);
            lVar40 = *(long *)(lVar14 + 0x10 + (long)(int)local_1e60._8_4_ * 0x38);
            pfVar33 = (float *)(lVar47 + lVar40 * uVar35);
            fVar101 = *pfVar33;
            fVar99 = pfVar33[1];
            fVar100 = pfVar33[2];
            lVar39 = (long)(local_1e60._8_4_ + 1) * 0x38;
            lVar46 = *(long *)(lVar14 + lVar39);
            lVar14 = *(long *)(lVar14 + 0x10 + lVar39);
            pfVar33 = (float *)(lVar46 + uVar35 * lVar14);
            fVar102 = *pfVar33;
            fVar103 = pfVar33[1];
            fVar64 = pfVar33[2];
            pfVar33 = (float *)(lVar47 + lVar40 * uVar32);
            fVar65 = *pfVar33;
            fVar66 = pfVar33[1];
            fVar69 = pfVar33[2];
            pfVar33 = (float *)(lVar46 + uVar32 * lVar14);
            fVar70 = *pfVar33;
            fVar71 = pfVar33[1];
            fVar72 = pfVar33[2];
            auVar62._0_4_ = (float)local_1ed8._0_4_ * (float)(local_1e60._8_4_ + 1);
            auVar62._4_4_ = (float)local_1ed8._0_4_ * (float)(int)local_1e60._8_4_;
            auVar62._8_4_ = (float)local_1ed8._0_4_ * 0.0;
            auVar62._12_4_ = (float)local_1ed8._0_4_ * 0.0;
            auVar78._4_4_ = local_1ea8._0_4_;
            auVar78._0_4_ = local_1ea8._0_4_;
            auVar78._8_4_ = local_1ea8._0_4_;
            auVar78._12_4_ = local_1ea8._0_4_;
            auVar73 = divps(auVar62,auVar78);
            fVar57 = (float)local_1e78._0_4_ + auVar73._4_4_;
            fVar59 = 1.0 / (((float)local_1e78._0_4_ + auVar73._0_4_) - fVar57);
            fVar77 = -fVar57 * fVar59;
            fVar54 = 1.0 - fVar77;
            fVar59 = (1.0 - fVar57) * fVar59;
            fVar60 = 1.0 - fVar59;
            pfVar33 = (float *)(lVar47 + lVar40 * uVar26);
            fVar57 = *pfVar33;
            fVar86 = pfVar33[1];
            fVar76 = pfVar33[2];
            pfVar33 = (float *)(lVar46 + lVar14 * uVar26);
            fVar80 = *pfVar33;
            fVar81 = pfVar33[1];
            fVar82 = pfVar33[2];
            *(float *)((long)&va0.field_0 + uVar51 * 4) = fVar54 * fVar101 + fVar77 * fVar102;
            *(float *)((long)&va0.field_0 + uVar51 * 4 + 0x10) = fVar54 * fVar99 + fVar77 * fVar103;
            *(float *)((long)&va0.field_0 + uVar51 * 4 + 0x20) = fVar54 * fVar100 + fVar77 * fVar64;
            *(float *)((long)&va1.field_0 + uVar51 * 4) = fVar101 * fVar60 + fVar102 * fVar59;
            *(float *)((long)&va1.field_0 + uVar51 * 4 + 0x10) = fVar99 * fVar60 + fVar103 * fVar59;
            *(float *)((long)&va1.field_0 + uVar51 * 4 + 0x20) = fVar100 * fVar60 + fVar64 * fVar59;
            *(float *)((long)&values[0].ref.ptr + uVar51 * 4) = fVar54 * fVar65 + fVar77 * fVar70;
            values[0].lbounds.bounds0.lower.field_0.m128[uVar51] = fVar54 * fVar66 + fVar77 * fVar71
            ;
            values[0].lbounds.bounds0.upper.field_0.m128[uVar51] = fVar54 * fVar69 + fVar77 * fVar72
            ;
            *(float *)((long)&vb1.field_0 + uVar51 * 4) = fVar65 * fVar60 + fVar70 * fVar59;
            *(float *)((long)&vb1.field_0 + uVar51 * 4 + 0x10) = fVar66 * fVar60 + fVar71 * fVar59;
            *(float *)((long)&vb1.field_0 + uVar51 * 4 + 0x20) = fVar69 * fVar60 + fVar72 * fVar59;
            *(float *)((long)&vc0.field_0 + uVar51 * 4) = fVar54 * fVar57 + fVar77 * fVar80;
            *(float *)((long)&vc0.field_0 + uVar51 * 4 + 0x10) = fVar54 * fVar86 + fVar77 * fVar81;
            *(float *)((long)&vc0.field_0 + uVar51 * 4 + 0x20) = fVar54 * fVar76 + fVar77 * fVar82;
            *(float *)((long)&vc1.field_0 + uVar51 * 4) = fVar60 * fVar57 + fVar59 * fVar80;
            *(float *)((long)&vc1.field_0 + uVar51 * 4 + 0x10) = fVar60 * fVar86 + fVar59 * fVar81;
            *(float *)((long)&vc1.field_0 + uVar51 * 4 + 0x20) = fVar60 * fVar76 + fVar59 * fVar82;
            vgeomID.field_0.i[uVar51] = (uint)fVar94;
            vprimID.field_0.i[uVar51] = (uint)local_1e50._M_p;
            BVar49 = (BBox1f)((long)BVar49 + 1);
            aVar63 = _DAT_01f7a9f0;
            aVar68 = _DAT_01f7aa00;
            pBVar108 = this;
          } while ((uVar51 < 3) && (uVar51 = uVar51 + 1, (ulong)BVar49 < uVar19));
        }
        aVar79.m128 = (__m128)maxps(aVar79.m128,local_1e88.m128);
        aVar85.m128 = (__m128)minps(aVar85.m128,aVar105.m128);
        aVar75.m128 = (__m128)maxps(aVar75.m128,local_1ab8.m128);
        aVar93.m128 = (__m128)minps(aVar93.m128,aVar98.m128);
        pcVar36 = pcVar37 + lVar29 * 0x140;
        *(undefined8 *)pcVar36 = va0.field_0._0_8_;
        *(undefined8 *)(pcVar36 + 8) = va0.field_0._8_8_;
        *(undefined8 *)(pcVar36 + 0x10) = va0.field_0._16_8_;
        *(undefined8 *)(pcVar36 + 0x18) = va0.field_0._24_8_;
        *(undefined8 *)(pcVar36 + 0x20) = va0.field_0._32_8_;
        *(undefined8 *)(pcVar36 + 0x28) = va0.field_0._40_8_;
        *(size_t *)(pcVar36 + 0x30) = values[0].ref.ptr;
        pcVar36[0x38] = values[0]._8_1_;
        pcVar36[0x39] = values[0]._9_1_;
        pcVar36[0x3a] = values[0]._10_1_;
        pcVar36[0x3b] = values[0]._11_1_;
        pcVar36[0x3c] = values[0]._12_1_;
        pcVar36[0x3d] = values[0]._13_1_;
        pcVar36[0x3e] = values[0]._14_1_;
        pcVar36[0x3f] = values[0]._15_1_;
        *(undefined8 *)(pcVar36 + 0x40) = values[0].lbounds.bounds0.lower.field_0._0_8_;
        *(undefined8 *)(pcVar36 + 0x48) = values[0].lbounds.bounds0.lower.field_0._8_8_;
        *(undefined8 *)(pcVar36 + 0x50) = values[0].lbounds.bounds0.upper.field_0._0_8_;
        *(undefined8 *)(pcVar36 + 0x58) = values[0].lbounds.bounds0.upper.field_0._8_8_;
        *(undefined8 *)(pcVar36 + 0x60) = vc0.field_0._0_8_;
        *(undefined8 *)(pcVar36 + 0x68) = vc0.field_0._8_8_;
        *(ulong *)(pcVar36 + 0x70) = CONCAT44(vc0.field_0._20_4_,vc0.field_0._16_4_);
        *(ulong *)(pcVar36 + 0x78) = CONCAT44(vc0.field_0._28_4_,vc0.field_0._24_4_);
        *(ulong *)(pcVar36 + 0x80) = CONCAT44(vc0.field_0._36_4_,vc0.field_0._32_4_);
        *(ulong *)(pcVar36 + 0x88) = CONCAT44(vc0.field_0._44_4_,vc0.field_0._40_4_);
        *(float *)(pcVar36 + 0x90) = (float)va1.field_0._0_4_ - (float)va0.field_0._0_4_;
        *(float *)(pcVar36 + 0x94) = (float)va1.field_0._4_4_ - (float)va0.field_0._4_4_;
        *(float *)(pcVar36 + 0x98) = (float)va1.field_0._8_4_ - (float)va0.field_0._8_4_;
        *(float *)(pcVar36 + 0x9c) = (float)va1.field_0._12_4_ - (float)va0.field_0._12_4_;
        *(float *)(pcVar36 + 0xa0) = (float)va1.field_0._16_4_ - (float)va0.field_0._16_4_;
        *(float *)(pcVar36 + 0xa4) = (float)va1.field_0._20_4_ - (float)va0.field_0._20_4_;
        *(float *)(pcVar36 + 0xa8) = (float)va1.field_0._24_4_ - (float)va0.field_0._24_4_;
        *(float *)(pcVar36 + 0xac) = (float)va1.field_0._28_4_ - (float)va0.field_0._28_4_;
        *(float *)(pcVar36 + 0xb0) = (float)va1.field_0._32_4_ - (float)va0.field_0._32_4_;
        *(float *)(pcVar36 + 0xb4) = (float)va1.field_0._36_4_ - (float)va0.field_0._36_4_;
        *(float *)(pcVar36 + 0xb8) = (float)va1.field_0._40_4_ - (float)va0.field_0._40_4_;
        *(float *)(pcVar36 + 0xbc) = (float)va1.field_0._44_4_ - (float)va0.field_0._44_4_;
        *(float *)(pcVar36 + 0xc0) = (float)vb1.field_0._0_4_ - (float)values[0].ref.ptr;
        *(float *)(pcVar36 + 0xc4) = (float)vb1.field_0._4_4_ - values[0].ref.ptr._4_4_;
        *(float *)(pcVar36 + 200) = (float)vb1.field_0._8_4_ - (float)values[0]._8_4_;
        *(float *)(pcVar36 + 0xcc) = (float)vb1.field_0._12_4_ - (float)values[0]._12_4_;
        *(float *)(pcVar36 + 0xd0) =
             (float)vb1.field_0._16_4_ - (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
        *(float *)(pcVar36 + 0xd4) =
             (float)vb1.field_0._20_4_ - (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
        *(float *)(pcVar36 + 0xd8) =
             (float)vb1.field_0._24_4_ - (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
        *(float *)(pcVar36 + 0xdc) =
             (float)vb1.field_0._28_4_ - (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
        *(float *)(pcVar36 + 0xe0) =
             (float)vb1.field_0._32_4_ - (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
        *(float *)(pcVar36 + 0xe4) =
             (float)vb1.field_0._36_4_ - (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
        *(float *)(pcVar36 + 0xe8) =
             (float)vb1.field_0._40_4_ - (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
        *(float *)(pcVar36 + 0xec) =
             (float)vb1.field_0._44_4_ - (float)values[0].lbounds.bounds0.upper.field_0._12_4_;
        *(float *)(pcVar36 + 0xf0) = (float)vc1.field_0._0_4_ - (float)vc0.field_0._0_4_;
        *(float *)(pcVar36 + 0xf4) = (float)vc1.field_0._4_4_ - (float)vc0.field_0._4_4_;
        *(float *)(pcVar36 + 0xf8) = (float)vc1.field_0._8_4_ - (float)vc0.field_0._8_4_;
        *(float *)(pcVar36 + 0xfc) = (float)vc1.field_0._12_4_ - (float)vc0.field_0._12_4_;
        *(float *)(pcVar36 + 0x100) = (float)vc1.field_0._16_4_ - (float)vc0.field_0._16_4_;
        *(float *)(pcVar36 + 0x104) = (float)vc1.field_0._20_4_ - (float)vc0.field_0._20_4_;
        *(float *)(pcVar36 + 0x108) = (float)vc1.field_0._24_4_ - (float)vc0.field_0._24_4_;
        *(float *)(pcVar36 + 0x10c) = (float)vc1.field_0._28_4_ - (float)vc0.field_0._28_4_;
        *(float *)(pcVar36 + 0x110) = (float)vc1.field_0._32_4_ - (float)vc0.field_0._32_4_;
        *(float *)(pcVar36 + 0x114) = (float)vc1.field_0._36_4_ - (float)vc0.field_0._36_4_;
        *(float *)(pcVar36 + 0x118) = (float)vc1.field_0._40_4_ - (float)vc0.field_0._40_4_;
        *(float *)(pcVar36 + 0x11c) = (float)vc1.field_0._44_4_ - (float)vc0.field_0._44_4_;
        *(longlong *)(pcVar36 + 0x120) = vgeomID.field_0.v[0];
        *(longlong *)(pcVar36 + 0x128) = vgeomID.field_0.v[1];
        *(longlong *)(pcVar36 + 0x130) = vprimID.field_0.v[0];
        *(longlong *)(pcVar36 + 0x138) = vprimID.field_0.v[1];
        lVar29 = lVar29 + 1;
      } while (lVar29 != uVar38 + (uVar38 == 0));
    }
    *(ulong *)local_1e60._M_allocated_capacity = uVar43 | (ulong)pcVar37 | 8;
    (((LBBox3fa *)(local_1e60._M_allocated_capacity + 0x10))->bounds0).lower.field_0 = aVar93;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(local_1e60._M_allocated_capacity + 0x20) = aVar75;
    (((BBox<embree::Vec3fa> *)(local_1e60._M_allocated_capacity + 0x30))->lower).field_0 = aVar85;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(local_1e60._M_allocated_capacity + 0x40) = aVar79;
    *(BBox1f *)(local_1e60._M_allocated_capacity + 0x50) =
         current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return (NodeRecordMB4D *)local_1e60._M_allocated_capacity;
  }
  lVar29 = 0xbc;
  do {
    *(undefined8 *)((long)&fStack_17d4 + lVar29) = 0xffffffff7f800000;
    *(undefined8 *)((long)&uStack_17cc + lVar29) = 0;
    lVar29 = lVar29 + 0xf0;
  } while (lVar29 != 0xfbc);
  local_848 = (Device *)0x1;
  local_840._512_8_ = 1;
  va0.field_0._16_8_ = local_1e98;
  va0.field_0._24_8_ = _Stack_1e90._M_p;
  va0.field_0._32_8_ = local_1e78._0_8_;
  va0.field_0._40_8_ = local_1e78._8_8_;
  local_1798._0_8_ = local_1ed8;
  local_1798._8_8_ = uStack_1ed0;
  local_1788._M_allocated_capacity = local_1ec8._0_8_;
  local_1788._8_8_ = local_1ec8._8_8_;
  local_1778._0_8_ = local_1ea8._0_8_;
  local_1778._8_8_ = local_1ea8._8_8_;
  local_1768._M_allocated_capacity._0_4_ = local_1e28;
  local_1768._M_allocated_capacity._4_4_ = fStack_1e24;
  local_1768._8_4_ = (undefined4)aaStack_1e20[0]._M_allocated_capacity;
  local_1768._12_4_ = aaStack_1e20[0]._M_allocated_capacity._4_4_;
  local_1748._8_8_ = values[0]._8_8_;
  local_1748._M_allocated_capacity = values[0].ref.ptr;
  local_1758[0] = BVar49;
  local_1758[1] = BVar5;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728._M_allocated_capacity = (size_type)pmVar6;
  local_1718._M_b._M_p = (__base_type)(__base_type)va0.field_0._0_8_;
  uStack_1710 = va0.field_0._8_8_;
  local_840._0_8_ = pmVar6;
  local_840._8_8_ = 2;
  local_8c8[0] = (FastAllocator *)local_840;
  local_1ec8._0_8_ = local_1c28;
  local_1ea8._0_8_ = &local_1b18;
  local_1eb0._M_p = (pointer)&this->heuristicTemporalSplit;
  local_1e50._M_p = (pointer)&local_1c58;
  local_1e60._8_8_ = &local_1b48;
  local_1e78._8_8_ = 0x7f8000007f800000;
  local_1e78._0_8_ = 0x7f8000007f800000;
  _Stack_1e90._M_p = (pointer)0xff800000ff800000;
  local_1e98 = (undefined1  [8])0xff800000ff800000;
  uVar51 = 0;
  va0.field_0._0_8_ = uVar38;
  do {
    if (local_848 == (Device *)0x0) goto LAB_00c503e4;
    pDVar50 = (Device *)0xffffffffffffffff;
    pBVar34 = local_1758;
    uVar38 = 0;
    uVar42 = (Device *)0x0;
    do {
      uVar43 = (long)pBVar34[1] - (long)*pBVar34;
      if ((((this->cfg).maxLeafSize < uVar43) || (1 < (uint)pBVar34[9].upper)) || (bVar18)) {
        if (uVar38 < uVar43) {
          pDVar50 = (Device *)uVar42;
          uVar38 = uVar43;
        }
        bVar18 = false;
      }
      uVar42 = (long)&(((Device *)uVar42)->super_State).super_RefCount._vptr_RefCount + 1;
      pBVar34 = pBVar34 + 0x1e;
    } while (local_848 != (Device *)uVar42);
    if (pDVar50 == (Device *)0xffffffffffffffff) goto LAB_00c5039a;
    vc0.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    local_1c28._0_8_ = 0xffffffff7f800000;
    local_1c28._8_8_ = 0;
    local_1b18._M_p = (pointer)0xffffffff7f800000;
    auStack_1b10._0_8_ = 0;
    iVar4 = *(int *)((long)&uStack_1710 + (long)pDVar50 * 0xf0U + 4U);
    local_1ed8 = (undefined1  [8])(&va0 + (long)pDVar50 * 5);
    local_1ab8._0_8_ = uVar51;
    va1.field_0._0_8_ = vc0.field_0._0_8_;
    if (iVar4 == 0) {
      local_1c68._0_8_ = local_1758[(long)pDVar50 * 0x1e];
      local_1b58._8_8_ = *(BBox1f *)(local_1748._M_local_buf + (long)pDVar50 * 0xf0 + -8);
      vb1.field_0._0_8_ = 0x7f8000007f800000;
      vb1.field_0._8_8_ = 0x7f8000007f800000;
      vb1.field_0._16_8_ = 0xff800000ff800000;
      vb1.field_0._24_8_ = 0xff800000ff800000;
      vb1.field_0._32_8_ = 0x7f8000007f800000;
      vb1.field_0._40_8_ = 0x7f8000007f800000;
      local_1d38._0_8_ = 0xff800000ff800000;
      local_1d38._8_8_ = 0xff800000ff800000;
      local_1d28._0_4_ = INFINITY;
      local_1d28._4_4_ = INFINITY;
      local_1d28._8_8_ = 0x7f8000007f800000;
      local_1d18._0_8_ = 0xff800000ff800000;
      local_1d18._8_8_ = 0xff800000ff800000;
      local_1ce8._0_4_ = 0.0;
      local_1d08._16_8_ = (pointer)0x0;
      _Stack_1cf0._M_p = (pointer)0x0;
      local_1d08._0_4_ = 0.0;
      local_1d08._4_4_ = 0.0;
      local_1d08._8_4_ = 0.0;
      local_1d08._12_4_ = 0.0;
      local_1ce8._4_4_ = 1.0;
      local_1ce8._8_4_ = 1.0;
      local_1ce8._12_4_ = 0.0;
      vc1.field_0._0_8_ = 0x7f8000007f800000;
      vc1.field_0._8_8_ = 0x7f8000007f800000;
      vc1.field_0._16_8_ = 0xff800000ff800000;
      vc1.field_0._24_8_ = 0xff800000ff800000;
      vc1.field_0._32_8_ = 0x7f8000007f800000;
      vc1.field_0._40_8_ = 0x7f8000007f800000;
      vprimID.field_0.i[1] = *(undefined4 *)((long)&uStack_1710 + (long)pDVar50 * 0xf0);
      vprimID.field_0.i[0] = vprimID.field_0.i[1];
      vprimID.field_0.i[3] = vprimID.field_0.i[1];
      vprimID.field_0.i[2] = vprimID.field_0.i[1];
      lVar29 = (long)(1 << (*(undefined1 *)
                             ((long)&uStack_1710 + ((long)pDVar50 * 0x1e + -1) * 8 + 4U) & 0x1f)) *
               0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar29);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
      vgeomID.field_0.v[1] = (longlong)&vprimID;
      vgeomID.field_0.v[0] = (longlong)(&local_1718 + (long)pDVar50 * 0x1e);
      local_1c68._8_8_ =
           parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                     (*(PrimRefMB **)
                       (*(long *)(local_1728._M_local_buf + (long)pDVar50 * 0xf0) + 0x20),
                      local_1c68._0_8_,local_1b58._8_8_,(EmptyTy *)local_1a38,
                      (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1,
                      (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,
                      (anon_class_24_3_c5d13451 *)&vgeomID,&reduction,&reduction2,0x80,0xc00);
      pDVar30 = *(Device **)(local_1728._M_local_buf + (long)pDVar50 * 0xf0);
      uVar38 = *(ulong *)(local_1728._M_local_buf + ((long)pDVar50 * 0x1e + -1) * 8);
      local_1c98._8_8_ = 0xff800000ff800000;
      local_1c98._0_8_ = 0xff800000ff800000;
      vc0.field_0._16_4_ = (undefined4)vb1.field_0._0_8_;
      vc0.field_0._20_4_ = (undefined4)((ulong)vb1.field_0._0_8_ >> 0x20);
      vc0.field_0._24_4_ = (undefined4)vb1.field_0._8_8_;
      vc0.field_0._28_4_ = (undefined4)((ulong)vb1.field_0._8_8_ >> 0x20);
      vc0.field_0._32_4_ = (undefined4)vb1.field_0._16_8_;
      vc0.field_0._36_4_ = (undefined4)((ulong)vb1.field_0._16_8_ >> 0x20);
      vc0.field_0._40_4_ = (undefined4)vb1.field_0._24_8_;
      vc0.field_0._44_4_ = (undefined4)((ulong)vb1.field_0._24_8_ >> 0x20);
      local_1ca8._0_8_ = vb1.field_0._32_8_;
      local_1ca8._8_8_ = vb1.field_0._40_8_;
      local_1c88._0_4_ = INFINITY;
      local_1c88._4_4_ = INFINITY;
      local_1c88._8_8_ = 0x7f8000007f800000;
      local_1c88._16_8_ = (pointer)0xff800000ff800000;
      _Stack_1c70._M_p = (pointer)0xff800000ff800000;
      ((__atomic_base<unsigned_long> *)(local_1e50._M_p + 0x10))->_M_i = 0x3f80000000000000;
      ((__atomic_base<unsigned_long> *)(local_1e50._M_p + 0x18))->_M_i =
           (__int_type_conflict)&DAT_3f800000;
      local_1e50._M_p[0] = '\0';
      local_1e50._M_p[1] = '\0';
      local_1e50._M_p[2] = '\0';
      local_1e50._M_p[3] = '\0';
      local_1e50._M_p[4] = '\0';
      local_1e50._M_p[5] = '\0';
      local_1e50._M_p[6] = '\0';
      local_1e50._M_p[7] = '\0';
      ((__atomic_base<unsigned_long> *)(local_1e50._M_p + 8))->_M_i = 0;
      fVar89 = (float)uVar38;
      fVar95 = fVar89;
      if (fVar89 <= (float)auStack_1c40._0_4_) {
        fVar95 = (float)auStack_1c40._0_4_;
      }
      fVar94 = (float)(uVar38 >> 0x20);
      if (fVar94 <= (float)auStack_1c40._4_4_) {
        auStack_1c40._4_4_ = fVar94;
      }
      auStack_1c40._0_4_ = fVar95;
      va1.field_0._16_8_ = vc1.field_0._0_8_;
      va1.field_0._24_8_ = vc1.field_0._8_8_;
      va1.field_0._32_8_ = vc1.field_0._16_8_;
      va1.field_0._40_8_ = vc1.field_0._24_8_;
      local_1b98 = vc1.field_0._32_8_;
      auStack_1b90._0_8_ = vc1.field_0._40_8_;
      auStack_1b90._8_8_ = 0xff800000ff800000;
      auStack_1b90._16_8_ = 0xff800000ff800000;
      local_1b78._M_allocated_capacity = 0x7f8000007f800000;
      local_1b78._8_8_ = 0x7f8000007f800000;
      local_1b68._M_allocated_capacity = 0xff800000ff800000;
      local_1b68._8_4_ = -INFINITY;
      local_1b68._12_4_ = -INFINITY;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1e60._8_8_ + 0x10))->_M_allocated_capacity = 0x3f80000000000000;
      *(undefined1 **)(local_1e60._8_8_ + 0x18) = &DAT_3f800000;
      *(size_type *)local_1e60._8_8_ = 0;
      pcVar37 = (char *)(local_1e60._8_8_ + 8);
      pcVar37[0] = '\0';
      pcVar37[1] = '\0';
      pcVar37[2] = '\0';
      pcVar37[3] = '\0';
      pcVar37[4] = '\0';
      pcVar37[5] = '\0';
      pcVar37[6] = '\0';
      pcVar37[7] = '\0';
      if (fVar89 <= (float)auStack_1b30._0_4_) {
        uVar38 = auStack_1b30._0_8_ & 0xffffffff;
      }
      if (fVar94 <= (float)auStack_1b30._4_4_) {
        auStack_1b30._4_4_ = fVar94;
      }
      auStack_1b30._0_8_ = CONCAT44(auStack_1b30._4_4_,(int)uVar38);
      pBVar108 = this;
      auStack_1c40._8_8_ = pDVar30;
      local_1b58._M_allocated_capacity = local_1c68._8_8_;
      auStack_1b30._8_8_ = pDVar30;
LAB_00c4f672:
      local_1ee0 = (undefined1  [8])0x0;
      bVar52 = false;
    }
    else {
      this_00 = &(&va0)[(long)pDVar50 * 5].field_0.field_0.y;
      local_1e88._0_8_ = this_00;
      if (iVar4 != 2) {
        if (iVar4 == 1) {
          SetMB::deterministic_order((SetMB *)this_00);
          splitFallback(this,(SetMB *)local_1e88._0_8_,(SetMB *)&vc0.field_0.field_0.y,
                        (SetMB *)&va1.field_0.field_0.y);
          pBVar108 = this;
        }
        else {
          pBVar108 = this;
          if (iVar4 == 3) {
            SetMB::deterministic_order((SetMB *)this_00);
            splitByGeometry(this,(SetMB *)local_1e88._0_8_,(SetMB *)&vc0.field_0.field_0.y,
                            (SetMB *)&va1.field_0.field_0.y);
            pBVar108 = this;
          }
        }
        goto LAB_00c4f672;
      }
      time_range1.lower = *(float *)((long)&uStack_1710 + (long)pDVar50 * 0xf0);
      time_range0.lower = *(float *)(local_1728._M_local_buf + ((long)pDVar50 * 0x1e + -1) * 8);
      time_range1.upper = *(float *)(local_1728._M_local_buf + ((long)pDVar50 * 0x1e + -1) * 8 + 4);
      pDVar30 = *(Device **)(local_1728._M_local_buf + (long)pDVar50 * 0xf0);
      time_range0.upper = time_range1.lower;
      pDVar23 = (Device *)operator_new(0x28);
      pp_Var10 = *(_func_int ***)local_1eb0._M_p;
      lVar29 = *(long *)(local_1748._M_local_buf + (long)pDVar50 * 0xf0 + -8);
      (pDVar23->super_State).super_RefCount._vptr_RefCount = pp_Var10;
      *(undefined1 *)
       &(pDVar23->super_State).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0
      ;
      (pDVar23->super_State).tri_accel._M_dataplus._M_p = (pointer)0x0;
      (pDVar23->super_State).tri_accel._M_string_length = 0;
      (pDVar23->super_State).tri_accel.field_2._M_allocated_capacity = 0;
      pcVar24 = (pointer)(lVar29 - (long)local_1758[(long)pDVar50 * 0x1e]);
      lVar47 = lVar29;
      pBVar108 = this;
      if (pcVar24 != (pointer)0x0) {
        uVar38 = (long)pcVar24 * 0x50;
        local_1ad8 = pcVar24;
        (**(code **)*pp_Var10)(pp_Var10,uVar38,0);
        if (uVar38 < 0x1c00000) {
          pvVar25 = alignedMalloc(uVar38,0x10);
        }
        else {
          pvVar25 = os_malloc(uVar38,(bool *)&(pDVar23->super_State).super_RefCount.refCounter);
        }
        (pDVar23->super_State).tri_accel.field_2._M_allocated_capacity = (size_type)pvVar25;
        (pDVar23->super_State).tri_accel._M_dataplus._M_p = local_1ad8;
        (pDVar23->super_State).tri_accel._M_string_length = (size_type)local_1ad8;
        lVar29 = *(long *)((long)local_1ed8 + 0x70);
        lVar47 = *(long *)((long)local_1ed8 + 0x78);
        pBVar108 = this;
      }
      uVar42 = vgeomID.field_0.v[1];
      vSplitMask.field_0._8_8_ = &time_range0;
      vc1.field_0._0_8_ = 0x7f8000007f800000;
      vc1.field_0._8_8_ = 0x7f8000007f800000;
      vc1.field_0._16_8_ = 0xff800000ff800000;
      vc1.field_0._24_8_ = 0xff800000ff800000;
      vc1.field_0._32_8_ = 0x7f8000007f800000;
      vc1.field_0._40_8_ = 0x7f8000007f800000;
      local_1ee0 = (undefined1  [8])pDVar23;
      vSplitMask.field_0._0_8_ = pDVar30;
      if ((ulong)(lVar47 - lVar29) < 0xc00) {
        vgeomID.field_0.v[0] = lVar29;
        vgeomID.field_0.v[1] = lVar47;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&vb1,(anon_class_40_5_808acc65 *)&vSplitMask,
                   (range<unsigned_long> *)&vgeomID);
      }
      else {
        vgeomID.field_0.v[1]._4_1_ = 1;
        vgeomID.field_0.v[1]._6_2_ = SUB82(uVar42,6);
        vgeomID.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vgeomID);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vprimID.field_0.v[0] = lVar47;
        vprimID.field_0.v[1] = lVar29;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMB *)&vb1,(d1 *)&vprimID,(blocked_range<unsigned_long> *)&vc1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vgeomID,(task_group_context *)pBVar108);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vgeomID);
        if (cVar22 != '\0') {
          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar28,"task cancelled");
          __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vgeomID);
      }
      lVar29 = *(long *)((long)local_1ed8 + 0x70);
      pcVar48 = *(code **)((long)local_1ed8 + 0x78);
      uVar38 = (long)pcVar48 - lVar29;
      if (local_1d08._8_8_ - local_1d08._0_8_ != uVar38) {
        vc1.field_0._0_8_ = &time_range0;
        local_1d08._8_8_ =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       ((PrimRefMB *)(pDVar23->super_State).tri_accel.field_2._M_allocated_capacity,
                        0,uVar38,0x400,(anon_class_8_1_41ce32a5 *)&vc1);
        lVar29 = *(long *)((long)local_1ed8 + 0x70);
        pcVar48 = *(code **)((long)local_1ed8 + 0x78);
        uVar38 = (long)pcVar48 - lVar29;
      }
      *(undefined8 *)local_1e50._M_p = local_1d08._16_8_;
      ((__atomic_base<unsigned_long> *)(local_1e50._M_p + 8))->_M_i =
           (__int_type_conflict)_Stack_1cf0._M_p;
      uVar42 = vprimID.field_0.v[1];
      vc0.field_0._16_4_ = (undefined4)vb1.field_0._0_8_;
      vc0.field_0._20_4_ = (undefined4)((ulong)vb1.field_0._0_8_ >> 0x20);
      vc0.field_0._24_4_ = (undefined4)vb1.field_0._8_8_;
      vc0.field_0._28_4_ = (undefined4)((ulong)vb1.field_0._8_8_ >> 0x20);
      vc0.field_0._32_4_ = (undefined4)vb1.field_0._16_8_;
      vc0.field_0._36_4_ = (undefined4)((ulong)vb1.field_0._16_8_ >> 0x20);
      vc0.field_0._40_4_ = (undefined4)vb1.field_0._24_8_;
      vc0.field_0._44_4_ = (undefined4)((ulong)vb1.field_0._24_8_ >> 0x20);
      local_1ca8._0_8_ = vb1.field_0._32_8_;
      local_1ca8._8_8_ = vb1.field_0._40_8_;
      local_1c98._8_8_ = local_1d38._8_8_;
      local_1c98._0_8_ = local_1d38._0_8_;
      local_1c88._0_8_ = local_1d28._0_8_;
      local_1c88._8_8_ = local_1d28._8_8_;
      local_1c88._16_8_ = local_1d18._0_8_;
      _Stack_1c70._M_p = (pointer)local_1d18._8_8_;
      local_1c68._0_8_ = local_1d08._0_8_;
      local_1c48 = (undefined1  [8])CONCAT44(local_1ce8._4_4_,local_1ce8._0_4_);
      auStack_1c40._0_8_ =
           CONCAT44(~-(uint)((float)local_1ce8._12_4_ < time_range0.upper) & (uint)time_range0.upper
                    ,~-(uint)((float)local_1ce8._8_4_ < time_range0.lower) & local_1ce8._8_4_) |
           CONCAT44(local_1ce8._12_4_ & -(uint)((float)local_1ce8._12_4_ < time_range0.upper),
                    (uint)time_range0.lower & -(uint)((float)local_1ce8._8_4_ < time_range0.lower));
      vgeomID.field_0.v[0] = 0x7f8000007f800000;
      vgeomID.field_0.v[1] = 0x7f8000007f800000;
      auStack_1c40._8_8_ = pDVar23;
      _reduction2 = pDVar30;
      if (uVar38 < 0xc00) {
        vprimID.field_0.v[0] = lVar29;
        vprimID.field_0.v[1] = (longlong)pcVar48;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&vc1,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vprimID);
      }
      else {
        vprimID.field_0.v[1]._4_1_ = 1;
        vprimID.field_0.v[1]._6_2_ = SUB82(uVar42,6);
        vprimID.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vprimID);
        local_1a38._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1a38._8_8_ = &reduction2;
        _reduction = pcVar48;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&vgeomID,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a38,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vprimID,(task_group_context *)pBVar108);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vprimID);
        if (cVar22 != '\0') {
          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar28,"task cancelled");
          __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vprimID);
      }
      local_1b58._M_allocated_capacity = (size_type)*(BBox1f *)((long)local_1ed8 + 0x70);
      local_1b58._8_8_ = local_1b58._M_allocated_capacity;
      if (*(BBox1f *)((long)local_1ed8 + 0x78) != (BBox1f)local_1b58._M_allocated_capacity) {
        vgeomID.field_0.v[0] = (longlong)&time_range1;
        local_1b58._8_8_ =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       ((PrimRefMB *)(pDVar30->super_State).tri_accel.field_2._M_allocated_capacity,
                        local_1b58._M_allocated_capacity,
                        (unsigned_long)*(BBox1f *)((long)local_1ed8 + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)&vgeomID);
      }
      va1.field_0._16_8_ = vc1.field_0._0_8_;
      va1.field_0._24_8_ = vc1.field_0._8_8_;
      va1.field_0._32_8_ = vc1.field_0._16_8_;
      va1.field_0._40_8_ = vc1.field_0._24_8_;
      local_1b98 = vc1.field_0._32_8_;
      auStack_1b90._0_8_ = vc1.field_0._40_8_;
      auStack_1b90._8_8_ = 0xff800000ff800000;
      auStack_1b90._16_8_ = 0xff800000ff800000;
      *(size_type *)local_1e60._8_8_ = 0;
      pcVar37 = (char *)(local_1e60._8_8_ + 8);
      pcVar37[0] = '\0';
      pcVar37[1] = '\0';
      pcVar37[2] = '\0';
      pcVar37[3] = '\0';
      pcVar37[4] = '\0';
      pcVar37[5] = '\0';
      pcVar37[6] = '\0';
      pcVar37[7] = '\0';
      local_1b78._M_allocated_capacity = (size_type)(pointer)0x7f8000007f800000;
      local_1b78._8_8_ = 0x7f8000007f800000;
      local_1b68._M_allocated_capacity = 0xff800000ff800000;
      local_1b68._8_4_ = -INFINITY;
      local_1b68._12_4_ = -INFINITY;
      local_1b38.lower = 0.0;
      local_1b38.upper = 1.0;
      auStack_1b30._0_8_ =
           CONCAT44(~-(uint)(0.0 < time_range1.upper) & (uint)time_range1.upper,
                    ~-(uint)(1.0 < time_range1.lower)) & 0xffffffff3f800000 |
           (ulong)((uint)time_range1.lower & -(uint)(1.0 < time_range1.lower));
      bVar52 = local_1ee0 != (undefined1  [8])0x0;
      local_1c68._8_8_ = local_1d08._8_8_;
      auStack_1b30._8_8_ = pDVar30;
    }
    uVar42 = &vb1;
    this = pBVar108;
    findFallback((Split *)uVar42,pBVar108,(SetMB *)&vc0.field_0.field_0.y);
    *(undefined8 *)local_1ec8._0_8_ = vb1.field_0._0_8_;
    *(undefined8 *)(local_1ec8._0_8_ + 8) = vb1.field_0._8_8_;
    local_1c28._16_8_ = vb1.field_0._16_8_;
    local_1c08._0_8_ = vb1.field_0._32_8_;
    local_1c08._8_8_ = vb1.field_0._40_8_;
    local_1c08._16_8_ = local_1d38._0_8_;
    _Stack_1bf0._M_p = (pointer)local_1d38._8_8_;
    findFallback((Split *)uVar42,pBVar108,(SetMB *)&va1.field_0.field_0.y);
    uVar16 = local_840._512_8_;
    *(undefined8 *)local_1ea8._0_8_ = vb1.field_0._0_8_;
    *(undefined8 *)(local_1ea8._0_8_ + 8) = vb1.field_0._8_8_;
    auStack_1b10._8_8_ = vb1.field_0._16_8_;
    local_1af8._M_p = (pointer)vb1.field_0._32_8_;
    auStack_1af0._0_8_ = vb1.field_0._40_8_;
    auStack_1af0._8_8_ = local_1d38._0_8_;
    auStack_1af0._16_8_ = local_1d38._8_8_;
    local_1ee0 = (undefined1  [8])0x0;
    pFVar7 = local_8c8[(long)pDVar50];
    if ((Device *)auStack_1c40._8_8_ == pFVar7->device) {
      pFVar7->slotMask = pFVar7->slotMask + 1;
      pDVar30 = (Device *)auStack_1c40._8_8_;
    }
    else {
      local_840._512_8_ = local_840._512_8_ + 1;
      uVar42 = local_840;
      (&(((Device *)uVar42)->super_State).super_RefCount)[uVar16]._vptr_RefCount =
           (_func_int **)auStack_1c40._8_8_;
      *(undefined8 *)(local_840 + uVar16 * 0x10 + 8) = 1;
      local_8c8[(long)pDVar50] =
           (FastAllocator *)(&(((Device *)uVar42)->super_State).super_RefCount + uVar16);
      pDVar30 = pFVar7->device;
    }
    uVar16 = local_840._512_8_;
    if ((Device *)auStack_1b30._8_8_ == pDVar30) {
      local_8c8[(long)local_848] = pFVar7;
      sVar31 = pFVar7->slotMask;
      pFVar7->slotMask = sVar31 + 1;
    }
    else {
      local_840._512_8_ = local_840._512_8_ + 1;
      uVar42 = local_840;
      (&(((Device *)uVar42)->super_State).super_RefCount)[uVar16]._vptr_RefCount =
           (_func_int **)auStack_1b30._8_8_;
      *(undefined8 *)(local_840 + uVar16 * 0x10 + 8) = 1;
      local_8c8[(long)local_848] =
           (FastAllocator *)(&(((Device *)uVar42)->super_State).super_RefCount + uVar16);
      sVar31 = pFVar7->slotMask - 1;
    }
    pFVar7->slotMask = sVar31;
    if (sVar31 == 0) {
      uVar42 = pFVar7->device;
      if ((Device *)uVar42 != (Device *)0x0) {
        lVar29 = *(long *)&((BinMapping<32UL> *)&(((Device *)uVar42)->super_State).tri_accel)->
                           field_0x8;
        pvVar25 = *(void **)&(((BinMapping<32UL> *)&(((Device *)uVar42)->super_State).tri_accel)->
                             ofs).field_0;
        if (pvVar25 != (void *)0x0) {
          if ((ulong)(lVar29 * 0x50) < 0x1c00000) {
            alignedFree(pvVar25);
          }
          else {
            os_free(pvVar25,lVar29 * 0x50,
                    *(bool *)&(((Device *)uVar42)->super_State).super_RefCount.refCounter);
          }
        }
        if (lVar29 != 0) {
          pp_Var10 = (((Device *)uVar42)->super_State).super_RefCount._vptr_RefCount;
          (**(code **)*pp_Var10)(pp_Var10,lVar29 * -0x50,1);
        }
        ((BinMapping<32UL> *)&(((Device *)uVar42)->super_State).tri_accel)->num = 0;
        *(undefined8 *)
         &((BinMapping<32UL> *)&(((Device *)uVar42)->super_State).tri_accel)->field_0x8 = 0;
        *(undefined8 *)
         &(((BinMapping<32UL> *)&(((Device *)uVar42)->super_State).tri_accel)->ofs).field_0 = 0;
      }
      operator_delete((void *)uVar42);
    }
    *(undefined8 *)local_1ed8 = vc0.field_0._0_8_;
    *(ulong *)((long)local_1ed8 + 0x10) = CONCAT44(vc0.field_0._20_4_,vc0.field_0._16_4_);
    *(ulong *)((long)local_1ed8 + 0x18) = CONCAT44(vc0.field_0._28_4_,vc0.field_0._24_4_);
    *(ulong *)((long)local_1ed8 + 0x20) = CONCAT44(vc0.field_0._36_4_,vc0.field_0._32_4_);
    *(ulong *)((long)local_1ed8 + 0x28) = CONCAT44(vc0.field_0._44_4_,vc0.field_0._40_4_);
    *(undefined8 *)((long)local_1ed8 + 0x30) = local_1ca8._0_8_;
    *(undefined8 *)((long)local_1ed8 + 0x38) = local_1ca8._8_8_;
    *(undefined8 *)((long)local_1ed8 + 0x40) = local_1c98._0_8_;
    *(undefined8 *)((long)local_1ed8 + 0x48) = local_1c98._8_8_;
    ((BBox1f *)((long)local_1ed8 + 0x50U))->lower = (float)local_1c88._0_4_;
    ((BBox1f *)((long)local_1ed8 + 0x50U))->upper = (float)local_1c88._4_4_;
    *(undefined8 *)((long)local_1ed8 + 0x58) = local_1c88._8_8_;
    *(undefined8 *)((long)local_1ed8 + 0x60) = local_1c88._16_8_;
    *(pointer *)((long)local_1ed8 + 0x68) = _Stack_1c70._M_p;
    ((BBox1f *)((long)local_1ed8 + 0x70U))->lower = (float)local_1c68._0_4_;
    ((BBox1f *)((long)local_1ed8 + 0x70U))->upper = (float)local_1c68._4_4_;
    ((BBox1f *)((long)local_1ed8 + 0x78U))->lower = (float)local_1c68._8_4_;
    ((BBox1f *)((long)local_1ed8 + 0x78U))->upper = (float)local_1c68._12_4_;
    *(__int_type_conflict *)((long)local_1ed8 + 0x80) = local_1c58._M_i;
    *(pointer *)((long)local_1ed8 + 0x88) = _Stack_1c50._M_p;
    *(undefined1 (*) [8])((long)local_1ed8 + 0x90) = local_1c48;
    *(undefined8 *)((long)local_1ed8 + 0x98) = auStack_1c40._0_8_;
    *(undefined8 *)((long)local_1ed8 + 0xa0) = auStack_1c40._8_8_;
    uVar16 = *(undefined8 *)(local_1ec8._0_8_ + 8);
    (&local_1718)[(long)pDVar50 * 0x1e]._M_b._M_p = *(__pointer_type *)local_1ec8._0_8_;
    *(undefined8 *)((long)&uStack_1710 + (long)pDVar50 * 0xf0) = uVar16;
    pDVar50 = local_848;
    *(undefined8 *)((long)local_1ed8 + 0xc0) = local_1c28._16_8_;
    *(undefined8 *)((long)local_1ed8 + 0xd0) = local_1c08._0_8_;
    *(undefined8 *)((long)local_1ed8 + 0xd8) = local_1c08._8_8_;
    *(undefined8 *)((long)local_1ed8 + 0xe0) = local_1c08._16_8_;
    *(pointer *)((long)local_1ed8 + 0xe8) = _Stack_1bf0._M_p;
    lVar29 = (long)local_848 * 0xf0;
    *(undefined8 *)&(&va0)[(long)local_848 * 5].field_0 = va1.field_0._0_8_;
    *(undefined8 *)((long)&(&va0)[(long)pDVar50 * 5].field_0 + 0x10) = va1.field_0._16_8_;
    *(undefined8 *)((long)&(&va0)[(long)pDVar50 * 5].field_0 + 0x18) = va1.field_0._24_8_;
    *(undefined8 *)((long)&(&va0)[(long)pDVar50 * 5].field_0 + 0x20) = va1.field_0._32_8_;
    *(undefined8 *)((long)&(&va0)[(long)pDVar50 * 5].field_0 + 0x28) = va1.field_0._40_8_;
    *(undefined8 *)(&local_1798 + (long)pDVar50 * 0xf) = local_1b98;
    *(undefined8 *)((long)&local_1798 + lVar29 + 8) = auStack_1b90._0_8_;
    *(undefined8 *)(local_1788._M_local_buf + (long)pDVar50 * 0xf0) = auStack_1b90._8_8_;
    *(undefined8 *)((long)&local_1788 + lVar29 + 8) = auStack_1b90._16_8_;
    *(size_type *)(&local_1778 + (long)pDVar50 * 0xf) = local_1b78._M_allocated_capacity;
    *(undefined8 *)((long)&local_1778 + lVar29 + 8) = local_1b78._8_8_;
    (&local_1768)[(long)pDVar50 * 0xf]._M_allocated_capacity = local_1b68._M_allocated_capacity;
    local_1758[(long)pDVar50 * 0x1e + -1].lower = (float)local_1b68._8_4_;
    local_1758[(long)pDVar50 * 0x1e + -1].upper = (float)local_1b68._12_4_;
    local_1758[(long)pDVar50 * 0x1e].lower = (float)local_1b58._M_allocated_capacity._0_4_;
    local_1758[(long)pDVar50 * 0x1e].upper = (float)local_1b58._M_allocated_capacity._4_4_;
    ((BBox1f *)(local_1748._M_local_buf + lVar29 + -8))->lower = (float)local_1b58._8_4_;
    ((BBox1f *)(local_1748._M_local_buf + lVar29 + -8))->upper = (float)local_1b58._12_4_;
    *(size_type *)(local_1748._M_local_buf + lVar29) = local_1b48._M_allocated_capacity;
    *(undefined8 *)(local_1748._M_local_buf + lVar29 + 8) = local_1b48._8_8_;
    (&local_1738)[(long)pDVar50 * 0x1e] = local_1b38;
    *(undefined8 *)(local_1728._M_local_buf + ((long)pDVar50 * 0x1e + -1) * 8) = auStack_1b30._0_8_;
    *(undefined8 *)(local_1728._M_local_buf + (long)pDVar50 * 0xf0) = auStack_1b30._8_8_;
    uVar16 = *(undefined8 *)(local_1ea8._0_8_ + 8);
    (&local_1718)[(long)pDVar50 * 0x1e]._M_b._M_p = *(__pointer_type *)local_1ea8._0_8_;
    *(undefined8 *)((long)&uStack_1710 + (long)pDVar50 * 0xf0) = uVar16;
    *(undefined8 *)((long)&uStack_1710 + ((long)pDVar50 * 0x1e + 1) * 8) = auStack_1b10._8_8_;
    *(pointer *)((long)&uStack_1710 + ((long)pDVar50 * 0x1e + 3) * 8) = local_1af8._M_p;
    *(undefined8 *)((long)&uStack_1710 + ((long)pDVar50 * 0x1e + 4) * 8) = auStack_1af0._0_8_;
    *(undefined8 *)((long)&uStack_1710 + ((long)pDVar50 * 0x1e + 5) * 8) = auStack_1af0._8_8_;
    *(undefined8 *)((long)&uStack_1710 + ((long)pDVar50 * 0x1e + 6) * 8) = auStack_1af0._16_8_;
    local_848 = (Device *)((long)&(local_848->super_State).super_RefCount._vptr_RefCount + 1);
    if (local_1ee0 != (undefined1  [8])0x0) {
      uVar42 = local_1ee0;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar42,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1ee0);
    }
    uVar51 = CONCAT71(local_1ab8._1_7_,local_1ab8._0_1_ | bVar52);
  } while (local_848 < (Device *)(this->cfg).branchingFactor);
  if (local_848 != (Device *)0x0) {
LAB_00c5039a:
    pfVar33 = &fStack_172c;
    pDVar50 = local_848;
    do {
      uVar51 = (ulong)(byte)((byte)uVar51 |
                            -(*pfVar33 < *(float *)(local_1ac8._M_allocated_capacity + 0x9c) ||
                             ((BBox1f *)(local_1ac8._M_allocated_capacity + 0x98))->lower <
                             pfVar33[-1]));
      pfVar33 = pfVar33 + 0x3c;
      pDVar50 = (Device *)
                ((long)&pDVar50[-1].bvh8_factory._M_t.
                        super___uniq_ptr_impl<embree::BVH8Factory,_std::default_delete<embree::BVH8Factory>_>
                        ._M_t + 7);
    } while (pDVar50 != (Device *)0x0);
  }
LAB_00c503e4:
  if ((uVar51 & 1) == 0) {
    vc1.field_0._0_8_ = 0xe0;
    pTVar8 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      va1.field_0._8_1_ = 1;
      va1.field_0._0_8_ = pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      vc0.field_0._8_1_ = 1;
      vb1.field_0._0_8_ = pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&vb1);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)vb1.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (va1.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)va1.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
    sVar31 = (alloc.talloc0)->cur;
    uVar38 = (ulong)(-(int)sVar31 & 0xf);
    uVar51 = sVar31 + vc1.field_0._0_8_ + uVar38;
    (alloc.talloc0)->cur = uVar51;
    if ((alloc.talloc0)->end < uVar51) {
      (alloc.talloc0)->cur = sVar31;
      if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
        pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
      }
      else {
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar37;
        sVar31 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar31;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
          (alloc.talloc0)->ptr = pcVar37;
          sVar31 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar31;
          (alloc.talloc0)->end = vc0.field_0._0_8_;
          (alloc.talloc0)->cur = vc1.field_0._0_8_;
          if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar37 = (char *)0x0;
            goto LAB_00c507ed;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar31;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar38;
      pcVar37 = (alloc.talloc0)->ptr + (uVar51 - vc1.field_0._0_8_);
    }
LAB_00c507ed:
    pcVar37[0x60] = '\0';
    pcVar37[0x61] = '\0';
    pcVar37[0x62] = -0x80;
    pcVar37[99] = '\x7f';
    pcVar37[100] = '\0';
    pcVar37[0x65] = '\0';
    pcVar37[0x66] = -0x80;
    pcVar37[0x67] = '\x7f';
    pcVar37[0x68] = '\0';
    pcVar37[0x69] = '\0';
    pcVar37[0x6a] = -0x80;
    pcVar37[0x6b] = '\x7f';
    pcVar37[0x6c] = '\0';
    pcVar37[0x6d] = '\0';
    pcVar37[0x6e] = -0x80;
    pcVar37[0x6f] = '\x7f';
    pcVar37[0x40] = '\0';
    pcVar37[0x41] = '\0';
    pcVar37[0x42] = -0x80;
    pcVar37[0x43] = '\x7f';
    pcVar37[0x44] = '\0';
    pcVar37[0x45] = '\0';
    pcVar37[0x46] = -0x80;
    pcVar37[0x47] = '\x7f';
    pcVar37[0x48] = '\0';
    pcVar37[0x49] = '\0';
    pcVar37[0x4a] = -0x80;
    pcVar37[0x4b] = '\x7f';
    pcVar37[0x4c] = '\0';
    pcVar37[0x4d] = '\0';
    pcVar37[0x4e] = -0x80;
    pcVar37[0x4f] = '\x7f';
    pcVar37[0x20] = '\0';
    pcVar37[0x21] = '\0';
    pcVar37[0x22] = -0x80;
    pcVar37[0x23] = '\x7f';
    pcVar37[0x24] = '\0';
    pcVar37[0x25] = '\0';
    pcVar37[0x26] = -0x80;
    pcVar37[0x27] = '\x7f';
    pcVar37[0x28] = '\0';
    pcVar37[0x29] = '\0';
    pcVar37[0x2a] = -0x80;
    pcVar37[0x2b] = '\x7f';
    pcVar37[0x2c] = '\0';
    pcVar37[0x2d] = '\0';
    pcVar37[0x2e] = -0x80;
    pcVar37[0x2f] = '\x7f';
    pcVar37[0x70] = '\0';
    pcVar37[0x71] = '\0';
    pcVar37[0x72] = -0x80;
    pcVar37[0x73] = -1;
    pcVar37[0x74] = '\0';
    pcVar37[0x75] = '\0';
    pcVar37[0x76] = -0x80;
    pcVar37[0x77] = -1;
    pcVar37[0x78] = '\0';
    pcVar37[0x79] = '\0';
    pcVar37[0x7a] = -0x80;
    pcVar37[0x7b] = -1;
    pcVar37[0x7c] = '\0';
    pcVar37[0x7d] = '\0';
    pcVar37[0x7e] = -0x80;
    pcVar37[0x7f] = -1;
    pcVar37[0x50] = '\0';
    pcVar37[0x51] = '\0';
    pcVar37[0x52] = -0x80;
    pcVar37[0x53] = -1;
    pcVar37[0x54] = '\0';
    pcVar37[0x55] = '\0';
    pcVar37[0x56] = -0x80;
    pcVar37[0x57] = -1;
    pcVar37[0x58] = '\0';
    pcVar37[0x59] = '\0';
    pcVar37[0x5a] = -0x80;
    pcVar37[0x5b] = -1;
    pcVar37[0x5c] = '\0';
    pcVar37[0x5d] = '\0';
    pcVar37[0x5e] = -0x80;
    pcVar37[0x5f] = -1;
    pcVar37[0x30] = '\0';
    pcVar37[0x31] = '\0';
    pcVar37[0x32] = -0x80;
    pcVar37[0x33] = -1;
    pcVar37[0x34] = '\0';
    pcVar37[0x35] = '\0';
    pcVar37[0x36] = -0x80;
    pcVar37[0x37] = -1;
    pcVar37[0x38] = '\0';
    pcVar37[0x39] = '\0';
    pcVar37[0x3a] = -0x80;
    pcVar37[0x3b] = -1;
    pcVar37[0x3c] = '\0';
    pcVar37[0x3d] = '\0';
    pcVar37[0x3e] = -0x80;
    pcVar37[0x3f] = -1;
    pcVar37[0x80] = '\0';
    pcVar37[0x81] = '\0';
    pcVar37[0x82] = '\0';
    pcVar37[0x83] = '\0';
    pcVar37[0x84] = '\0';
    pcVar37[0x85] = '\0';
    pcVar37[0x86] = '\0';
    pcVar37[0x87] = '\0';
    pcVar37[0x88] = '\0';
    pcVar37[0x89] = '\0';
    pcVar37[0x8a] = '\0';
    pcVar37[0x8b] = '\0';
    pcVar37[0x8c] = '\0';
    pcVar37[0x8d] = '\0';
    pcVar37[0x8e] = '\0';
    pcVar37[0x8f] = '\0';
    pcVar37[0x90] = '\0';
    pcVar37[0x91] = '\0';
    pcVar37[0x92] = '\0';
    pcVar37[0x93] = '\0';
    pcVar37[0x94] = '\0';
    pcVar37[0x95] = '\0';
    pcVar37[0x96] = '\0';
    pcVar37[0x97] = '\0';
    pcVar37[0x98] = '\0';
    pcVar37[0x99] = '\0';
    pcVar37[0x9a] = '\0';
    pcVar37[0x9b] = '\0';
    pcVar37[0x9c] = '\0';
    pcVar37[0x9d] = '\0';
    pcVar37[0x9e] = '\0';
    pcVar37[0x9f] = '\0';
    pcVar37[0xa0] = '\0';
    pcVar37[0xa1] = '\0';
    pcVar37[0xa2] = '\0';
    pcVar37[0xa3] = '\0';
    pcVar37[0xa4] = '\0';
    pcVar37[0xa5] = '\0';
    pcVar37[0xa6] = '\0';
    pcVar37[0xa7] = '\0';
    pcVar37[0xa8] = '\0';
    pcVar37[0xa9] = '\0';
    pcVar37[0xaa] = '\0';
    pcVar37[0xab] = '\0';
    pcVar37[0xac] = '\0';
    pcVar37[0xad] = '\0';
    pcVar37[0xae] = '\0';
    pcVar37[0xaf] = '\0';
    pcVar37[0xb0] = '\0';
    pcVar37[0xb1] = '\0';
    pcVar37[0xb2] = '\0';
    pcVar37[0xb3] = '\0';
    pcVar37[0xb4] = '\0';
    pcVar37[0xb5] = '\0';
    pcVar37[0xb6] = '\0';
    pcVar37[0xb7] = '\0';
    pcVar37[0xb8] = '\0';
    pcVar37[0xb9] = '\0';
    pcVar37[0xba] = '\0';
    pcVar37[0xbb] = '\0';
    pcVar37[0xbc] = '\0';
    pcVar37[0xbd] = '\0';
    pcVar37[0xbe] = '\0';
    pcVar37[0xbf] = '\0';
    pcVar37[0xc0] = '\0';
    pcVar37[0xc1] = '\0';
    pcVar37[0xc2] = '\0';
    pcVar37[0xc3] = '\0';
    pcVar37[0xc4] = '\0';
    pcVar37[0xc5] = '\0';
    pcVar37[0xc6] = '\0';
    pcVar37[199] = '\0';
    pcVar37[200] = '\0';
    pcVar37[0xc9] = '\0';
    pcVar37[0xca] = '\0';
    pcVar37[0xcb] = '\0';
    pcVar37[0xcc] = '\0';
    pcVar37[0xcd] = '\0';
    pcVar37[0xce] = '\0';
    pcVar37[0xcf] = '\0';
    pcVar37[0xd0] = '\0';
    pcVar37[0xd1] = '\0';
    pcVar37[0xd2] = '\0';
    pcVar37[0xd3] = '\0';
    pcVar37[0xd4] = '\0';
    pcVar37[0xd5] = '\0';
    pcVar37[0xd6] = '\0';
    pcVar37[0xd7] = '\0';
    pcVar37[0xd8] = '\0';
    pcVar37[0xd9] = '\0';
    pcVar37[0xda] = '\0';
    pcVar37[0xdb] = '\0';
    pcVar37[0xdc] = '\0';
    pcVar37[0xdd] = '\0';
    pcVar37[0xde] = '\0';
    pcVar37[0xdf] = '\0';
    pcVar37[0] = '\b';
    pcVar37[1] = '\0';
    pcVar37[2] = '\0';
    pcVar37[3] = '\0';
    pcVar37[4] = '\0';
    pcVar37[5] = '\0';
    pcVar37[6] = '\0';
    pcVar37[7] = '\0';
    pcVar37[8] = '\b';
    pcVar37[9] = '\0';
    pcVar37[10] = '\0';
    pcVar37[0xb] = '\0';
    pcVar37[0xc] = '\0';
    pcVar37[0xd] = '\0';
    pcVar37[0xe] = '\0';
    pcVar37[0xf] = '\0';
    pcVar37[0x10] = '\b';
    pcVar37[0x11] = '\0';
    pcVar37[0x12] = '\0';
    pcVar37[0x13] = '\0';
    pcVar37[0x14] = '\0';
    pcVar37[0x15] = '\0';
    pcVar37[0x16] = '\0';
    pcVar37[0x17] = '\0';
    pcVar37[0x18] = '\b';
    pcVar37[0x19] = '\0';
    pcVar37[0x1a] = '\0';
    pcVar37[0x1b] = '\0';
    pcVar37[0x1c] = '\0';
    pcVar37[0x1d] = '\0';
    pcVar37[0x1e] = '\0';
    pcVar37[0x1f] = '\0';
    uVar51 = 1;
    uVar38 = 0;
    goto LAB_00c50856;
  }
  vc1.field_0._0_8_ = 0x100;
  pTVar8 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
    va1.field_0._8_1_ = 1;
    va1.field_0._0_8_ = pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar8->alloc0).bytesUsed = 0;
    (pTVar8->alloc0).bytesWasted = 0;
    (pTVar8->alloc0).end = 0;
    (pTVar8->alloc0).allocBlockSize = 0;
    (pTVar8->alloc0).ptr = (char *)0x0;
    (pTVar8->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    vc0.field_0._8_1_ = 1;
    vb1.field_0._0_8_ = pTVar8;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar9._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&vb1);
    }
    else {
      *iVar9._M_current = (ThreadLocal2 *)vb1.field_0._0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    uVar42 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (va1.field_0._8_1_ == '\x01') {
      uVar42 = va1.field_0._0_8_;
      MutexSys::unlock((MutexSys *)va1.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
  sVar31 = (alloc.talloc0)->cur;
  uVar38 = (ulong)(-(int)sVar31 & 0xf);
  uVar51 = sVar31 + vc1.field_0._0_8_ + uVar38;
  (alloc.talloc0)->cur = uVar51;
  if ((alloc.talloc0)->end < uVar51) {
    (alloc.talloc0)->cur = sVar31;
    uVar42 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
      pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
    }
    else {
      vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
      (alloc.talloc0)->ptr = pcVar37;
      sVar31 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar31;
      (alloc.talloc0)->end = vc0.field_0._0_8_;
      (alloc.talloc0)->cur = vc1.field_0._0_8_;
      if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        uVar42 = alloc.alloc;
        pcVar37 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar37;
        sVar31 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar31;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar37 = (char *)0x0;
          goto LAB_00c506f4;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar31;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar38;
    pcVar37 = (alloc.talloc0)->ptr + (uVar51 - vc1.field_0._0_8_);
  }
LAB_00c506f4:
  pcVar37[0xe0] = '\0';
  pcVar37[0xe1] = '\0';
  pcVar37[0xe2] = -0x80;
  pcVar37[0xe3] = '\x7f';
  pcVar37[0xe4] = '\0';
  pcVar37[0xe5] = '\0';
  pcVar37[0xe6] = -0x80;
  pcVar37[0xe7] = '\x7f';
  pcVar37[0xe8] = '\0';
  pcVar37[0xe9] = '\0';
  pcVar37[0xea] = -0x80;
  pcVar37[0xeb] = '\x7f';
  pcVar37[0xec] = '\0';
  pcVar37[0xed] = '\0';
  pcVar37[0xee] = -0x80;
  pcVar37[0xef] = '\x7f';
  pcVar37[0xf0] = '\0';
  pcVar37[0xf1] = '\0';
  pcVar37[0xf2] = -0x80;
  pcVar37[0xf3] = -1;
  pcVar37[0xf4] = '\0';
  pcVar37[0xf5] = '\0';
  pcVar37[0xf6] = -0x80;
  pcVar37[0xf7] = -1;
  pcVar37[0xf8] = '\0';
  pcVar37[0xf9] = '\0';
  pcVar37[0xfa] = -0x80;
  pcVar37[0xfb] = -1;
  pcVar37[0xfc] = '\0';
  pcVar37[0xfd] = '\0';
  pcVar37[0xfe] = -0x80;
  pcVar37[0xff] = -1;
  pcVar37[0x60] = '\0';
  pcVar37[0x61] = '\0';
  pcVar37[0x62] = -0x80;
  pcVar37[99] = '\x7f';
  pcVar37[100] = '\0';
  pcVar37[0x65] = '\0';
  pcVar37[0x66] = -0x80;
  pcVar37[0x67] = '\x7f';
  pcVar37[0x68] = '\0';
  pcVar37[0x69] = '\0';
  pcVar37[0x6a] = -0x80;
  pcVar37[0x6b] = '\x7f';
  pcVar37[0x6c] = '\0';
  pcVar37[0x6d] = '\0';
  pcVar37[0x6e] = -0x80;
  pcVar37[0x6f] = '\x7f';
  pcVar37[0x40] = '\0';
  pcVar37[0x41] = '\0';
  pcVar37[0x42] = -0x80;
  pcVar37[0x43] = '\x7f';
  pcVar37[0x44] = '\0';
  pcVar37[0x45] = '\0';
  pcVar37[0x46] = -0x80;
  pcVar37[0x47] = '\x7f';
  pcVar37[0x48] = '\0';
  pcVar37[0x49] = '\0';
  pcVar37[0x4a] = -0x80;
  pcVar37[0x4b] = '\x7f';
  pcVar37[0x4c] = '\0';
  pcVar37[0x4d] = '\0';
  pcVar37[0x4e] = -0x80;
  pcVar37[0x4f] = '\x7f';
  pcVar37[0x20] = '\0';
  pcVar37[0x21] = '\0';
  pcVar37[0x22] = -0x80;
  pcVar37[0x23] = '\x7f';
  pcVar37[0x24] = '\0';
  pcVar37[0x25] = '\0';
  pcVar37[0x26] = -0x80;
  pcVar37[0x27] = '\x7f';
  pcVar37[0x28] = '\0';
  pcVar37[0x29] = '\0';
  pcVar37[0x2a] = -0x80;
  pcVar37[0x2b] = '\x7f';
  pcVar37[0x2c] = '\0';
  pcVar37[0x2d] = '\0';
  pcVar37[0x2e] = -0x80;
  pcVar37[0x2f] = '\x7f';
  pcVar37[0x70] = '\0';
  pcVar37[0x71] = '\0';
  pcVar37[0x72] = -0x80;
  pcVar37[0x73] = -1;
  pcVar37[0x74] = '\0';
  pcVar37[0x75] = '\0';
  pcVar37[0x76] = -0x80;
  pcVar37[0x77] = -1;
  pcVar37[0x78] = '\0';
  pcVar37[0x79] = '\0';
  pcVar37[0x7a] = -0x80;
  pcVar37[0x7b] = -1;
  pcVar37[0x7c] = '\0';
  pcVar37[0x7d] = '\0';
  pcVar37[0x7e] = -0x80;
  pcVar37[0x7f] = -1;
  pcVar37[0x50] = '\0';
  pcVar37[0x51] = '\0';
  pcVar37[0x52] = -0x80;
  pcVar37[0x53] = -1;
  pcVar37[0x54] = '\0';
  pcVar37[0x55] = '\0';
  pcVar37[0x56] = -0x80;
  pcVar37[0x57] = -1;
  pcVar37[0x58] = '\0';
  pcVar37[0x59] = '\0';
  pcVar37[0x5a] = -0x80;
  pcVar37[0x5b] = -1;
  pcVar37[0x5c] = '\0';
  pcVar37[0x5d] = '\0';
  pcVar37[0x5e] = -0x80;
  pcVar37[0x5f] = -1;
  pcVar37[0x30] = '\0';
  pcVar37[0x31] = '\0';
  pcVar37[0x32] = -0x80;
  pcVar37[0x33] = -1;
  pcVar37[0x34] = '\0';
  pcVar37[0x35] = '\0';
  pcVar37[0x36] = -0x80;
  pcVar37[0x37] = -1;
  pcVar37[0x38] = '\0';
  pcVar37[0x39] = '\0';
  pcVar37[0x3a] = -0x80;
  pcVar37[0x3b] = -1;
  pcVar37[0x3c] = '\0';
  pcVar37[0x3d] = '\0';
  pcVar37[0x3e] = -0x80;
  pcVar37[0x3f] = -1;
  pcVar37[0x80] = '\0';
  pcVar37[0x81] = '\0';
  pcVar37[0x82] = '\0';
  pcVar37[0x83] = '\0';
  pcVar37[0x84] = '\0';
  pcVar37[0x85] = '\0';
  pcVar37[0x86] = '\0';
  pcVar37[0x87] = '\0';
  pcVar37[0x88] = '\0';
  pcVar37[0x89] = '\0';
  pcVar37[0x8a] = '\0';
  pcVar37[0x8b] = '\0';
  pcVar37[0x8c] = '\0';
  pcVar37[0x8d] = '\0';
  pcVar37[0x8e] = '\0';
  pcVar37[0x8f] = '\0';
  pcVar37[0x90] = '\0';
  pcVar37[0x91] = '\0';
  pcVar37[0x92] = '\0';
  pcVar37[0x93] = '\0';
  pcVar37[0x94] = '\0';
  pcVar37[0x95] = '\0';
  pcVar37[0x96] = '\0';
  pcVar37[0x97] = '\0';
  pcVar37[0x98] = '\0';
  pcVar37[0x99] = '\0';
  pcVar37[0x9a] = '\0';
  pcVar37[0x9b] = '\0';
  pcVar37[0x9c] = '\0';
  pcVar37[0x9d] = '\0';
  pcVar37[0x9e] = '\0';
  pcVar37[0x9f] = '\0';
  pcVar37[0xa0] = '\0';
  pcVar37[0xa1] = '\0';
  pcVar37[0xa2] = '\0';
  pcVar37[0xa3] = '\0';
  pcVar37[0xa4] = '\0';
  pcVar37[0xa5] = '\0';
  pcVar37[0xa6] = '\0';
  pcVar37[0xa7] = '\0';
  pcVar37[0xa8] = '\0';
  pcVar37[0xa9] = '\0';
  pcVar37[0xaa] = '\0';
  pcVar37[0xab] = '\0';
  pcVar37[0xac] = '\0';
  pcVar37[0xad] = '\0';
  pcVar37[0xae] = '\0';
  pcVar37[0xaf] = '\0';
  pcVar37[0xb0] = '\0';
  pcVar37[0xb1] = '\0';
  pcVar37[0xb2] = '\0';
  pcVar37[0xb3] = '\0';
  pcVar37[0xb4] = '\0';
  pcVar37[0xb5] = '\0';
  pcVar37[0xb6] = '\0';
  pcVar37[0xb7] = '\0';
  pcVar37[0xb8] = '\0';
  pcVar37[0xb9] = '\0';
  pcVar37[0xba] = '\0';
  pcVar37[0xbb] = '\0';
  pcVar37[0xbc] = '\0';
  pcVar37[0xbd] = '\0';
  pcVar37[0xbe] = '\0';
  pcVar37[0xbf] = '\0';
  pcVar37[0xc0] = '\0';
  pcVar37[0xc1] = '\0';
  pcVar37[0xc2] = '\0';
  pcVar37[0xc3] = '\0';
  pcVar37[0xc4] = '\0';
  pcVar37[0xc5] = '\0';
  pcVar37[0xc6] = '\0';
  pcVar37[199] = '\0';
  pcVar37[200] = '\0';
  pcVar37[0xc9] = '\0';
  pcVar37[0xca] = '\0';
  pcVar37[0xcb] = '\0';
  pcVar37[0xcc] = '\0';
  pcVar37[0xcd] = '\0';
  pcVar37[0xce] = '\0';
  pcVar37[0xcf] = '\0';
  pcVar37[0xd0] = '\0';
  pcVar37[0xd1] = '\0';
  pcVar37[0xd2] = '\0';
  pcVar37[0xd3] = '\0';
  pcVar37[0xd4] = '\0';
  pcVar37[0xd5] = '\0';
  pcVar37[0xd6] = '\0';
  pcVar37[0xd7] = '\0';
  pcVar37[0xd8] = '\0';
  pcVar37[0xd9] = '\0';
  pcVar37[0xda] = '\0';
  pcVar37[0xdb] = '\0';
  pcVar37[0xdc] = '\0';
  pcVar37[0xdd] = '\0';
  pcVar37[0xde] = '\0';
  pcVar37[0xdf] = '\0';
  pcVar37[0] = '\b';
  pcVar37[1] = '\0';
  pcVar37[2] = '\0';
  pcVar37[3] = '\0';
  pcVar37[4] = '\0';
  pcVar37[5] = '\0';
  pcVar37[6] = '\0';
  pcVar37[7] = '\0';
  pcVar37[8] = '\b';
  pcVar37[9] = '\0';
  pcVar37[10] = '\0';
  pcVar37[0xb] = '\0';
  pcVar37[0xc] = '\0';
  pcVar37[0xd] = '\0';
  pcVar37[0xe] = '\0';
  pcVar37[0xf] = '\0';
  pcVar37[0x10] = '\b';
  pcVar37[0x11] = '\0';
  pcVar37[0x12] = '\0';
  pcVar37[0x13] = '\0';
  pcVar37[0x14] = '\0';
  pcVar37[0x15] = '\0';
  pcVar37[0x16] = '\0';
  pcVar37[0x17] = '\0';
  pcVar37[0x18] = '\b';
  pcVar37[0x19] = '\0';
  pcVar37[0x1a] = '\0';
  pcVar37[0x1b] = '\0';
  pcVar37[0x1c] = '\0';
  pcVar37[0x1d] = '\0';
  pcVar37[0x1e] = '\0';
  pcVar37[0x1f] = '\0';
  uVar38 = CONCAT71((int7)((ulong)uVar42 >> 8),1);
  uVar51 = 6;
LAB_00c50856:
  uStack_1ed0 = (pointer)0xff800000ff800000;
  local_1ed8 = (undefined1  [8])0xff800000ff800000;
  sVar55 = 0x7f8000007f800000;
  sVar58 = 0x7f8000007f800000;
  if (local_848 != (Device *)0x0) {
    local_1ea8._0_4_ = (int)uVar38;
    pBVar34 = &values[0].dt;
    pDVar50 = (Device *)0x0;
    local_1e78._8_8_ = 0x7f8000007f800000;
    local_1e78._0_8_ = 0x7f8000007f800000;
    local_1ec8._8_8_ = 0x7f8000007f800000;
    local_1ec8._0_8_ = 0x7f8000007f800000;
    _Stack_1e90._M_p = (pointer)0xff800000ff800000;
    local_1e98 = (undefined1  [8])0xff800000ff800000;
    uStack_1ed0 = (pointer)0xff800000ff800000;
    local_1ed8 = (undefined1  [8])0xff800000ff800000;
    in_00 = (BuildRecord *)&va0;
    do {
      createLargeLeaf((NodeRecordMB4D *)&vc0,this,in_00,alloc);
      auVar107 = _DAT_01f80810;
      auVar73 = _DAT_01f80800;
      pBVar34[-10].lower = (float)vc0.field_0._0_4_;
      pBVar34[-10].upper = (float)vc0.field_0._4_4_;
      auVar84._4_4_ = vc0.field_0._20_4_;
      auVar84._0_4_ = vc0.field_0._16_4_;
      auVar84._8_4_ = vc0.field_0._24_4_;
      auVar84._12_4_ = vc0.field_0._28_4_;
      *(undefined1 (*) [16])(pBVar34 + -8) = auVar84;
      auVar88._4_4_ = vc0.field_0._36_4_;
      auVar88._0_4_ = vc0.field_0._32_4_;
      auVar88._8_4_ = vc0.field_0._40_4_;
      auVar88._12_4_ = vc0.field_0._44_4_;
      *(undefined1 (*) [16])(pBVar34 + -6) = auVar88;
      auVar91._8_8_ = local_1ca8._8_8_;
      auVar91._0_8_ = local_1ca8._0_8_;
      *(undefined1 (*) [16])(pBVar34 + -4) = auVar91;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar34 + -2))->m128 = local_1c98;
      pBVar34->lower = (float)local_1c88._0_4_;
      pBVar34->upper = (float)local_1c88._4_4_;
      local_1e78._0_16_ = minps(local_1e78._0_16_,auVar84);
      _local_1e98 = maxps(_local_1e98,auVar88);
      local_1ec8._0_16_ = minps(local_1ec8._0_16_,auVar91);
      _local_1ed8 = maxps(_local_1ed8,(undefined1  [16])local_1c98);
      pDVar50 = (Device *)((long)&(pDVar50->super_State).super_RefCount._vptr_RefCount + 1);
      pBVar34 = pBVar34 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (pDVar50 < local_848);
    if (((uint)uVar51 | (uint)pcVar37 & 0xf) == 1) {
      if (local_848 != (Device *)0x0) {
        uVar38 = (ulong)pcVar37 & 0xfffffffffffffff0;
        pfVar33 = &values[0].dt.upper;
        pDVar50 = (Device *)0x0;
        do {
          *(undefined8 *)(uVar38 + (long)pDVar50 * 8) = *(undefined8 *)(pfVar33 + -0x15);
          fVar95 = ((BBox1f *)(pfVar33 + -1))->lower;
          fVar94 = 1.0 / (*pfVar33 - fVar95);
          fVar101 = -fVar95 * fVar94;
          fVar89 = 1.0 - fVar101;
          auVar87._0_4_ = pfVar33[-0x11] * fVar89 + pfVar33[-9] * fVar101;
          auVar87._4_4_ = pfVar33[-0x10] * fVar89 + pfVar33[-8] * fVar101;
          auVar87._8_4_ = pfVar33[-0xf] * fVar89 + pfVar33[-7] * fVar101;
          auVar87._12_4_ = pfVar33[-0xe] * fVar89 + pfVar33[-6] * fVar101;
          auVar90._0_4_ = fVar89 * pfVar33[-0xd] + fVar101 * pfVar33[-5];
          auVar90._4_4_ = fVar89 * pfVar33[-0xc] + fVar101 * pfVar33[-4];
          auVar90._8_4_ = fVar89 * pfVar33[-0xb] + fVar101 * pfVar33[-3];
          auVar90._12_4_ = fVar89 * pfVar33[-10] + fVar101 * pfVar33[-2];
          fVar94 = (1.0 - fVar95) * fVar94;
          fVar95 = 1.0 - fVar94;
          auVar83._0_4_ = pfVar33[-0x11] * fVar95 + pfVar33[-9] * fVar94;
          auVar83._4_4_ = pfVar33[-0x10] * fVar95 + pfVar33[-8] * fVar94;
          auVar83._8_4_ = pfVar33[-0xf] * fVar95 + pfVar33[-7] * fVar94;
          auVar83._12_4_ = pfVar33[-0xe] * fVar95 + pfVar33[-6] * fVar94;
          auVar96._0_4_ = fVar95 * pfVar33[-0xd] + fVar94 * pfVar33[-5];
          auVar96._4_4_ = fVar95 * pfVar33[-0xc] + fVar94 * pfVar33[-4];
          auVar96._8_4_ = fVar95 * pfVar33[-0xb] + fVar94 * pfVar33[-3];
          auVar96._12_4_ = fVar95 * pfVar33[-10] + fVar94 * pfVar33[-2];
          auVar88 = minps(auVar87,auVar107);
          auVar91 = maxps(auVar90,auVar73);
          auVar84 = minps(auVar83,auVar107);
          auVar97 = maxps(auVar96,auVar73);
          fVar95 = auVar88._0_4_ - ABS(auVar88._0_4_) * 4.7683716e-07;
          fVar89 = auVar88._4_4_ - ABS(auVar88._4_4_) * 4.7683716e-07;
          fVar94 = auVar88._8_4_ - ABS(auVar88._8_4_) * 4.7683716e-07;
          fVar101 = ABS(auVar91._0_4_) * 4.7683716e-07 + auVar91._0_4_;
          fVar99 = ABS(auVar91._4_4_) * 4.7683716e-07 + auVar91._4_4_;
          fVar100 = ABS(auVar91._8_4_) * 4.7683716e-07 + auVar91._8_4_;
          *(float *)(uVar38 + 0x20 + (long)pDVar50 * 4) = fVar95;
          *(float *)(uVar38 + 0x40 + (long)pDVar50 * 4) = fVar89;
          *(float *)(uVar38 + 0x60 + (long)pDVar50 * 4) = fVar94;
          *(float *)(uVar38 + 0x30 + (long)pDVar50 * 4) = fVar101;
          *(float *)(uVar38 + 0x50 + (long)pDVar50 * 4) = fVar99;
          *(float *)(uVar38 + 0x70 + (long)pDVar50 * 4) = fVar100;
          *(float *)(uVar38 + 0x80 + (long)pDVar50 * 4) =
               (auVar84._0_4_ - ABS(auVar84._0_4_) * 4.7683716e-07) - fVar95;
          *(float *)(uVar38 + 0xa0 + (long)pDVar50 * 4) =
               (auVar84._4_4_ - ABS(auVar84._4_4_) * 4.7683716e-07) - fVar89;
          *(float *)(uVar38 + 0xc0 + (long)pDVar50 * 4) =
               (auVar84._8_4_ - ABS(auVar84._8_4_) * 4.7683716e-07) - fVar94;
          *(float *)(uVar38 + 0x90 + (long)pDVar50 * 4) =
               (ABS(auVar97._0_4_) * 4.7683716e-07 + auVar97._0_4_) - fVar101;
          *(float *)(uVar38 + 0xb0 + (long)pDVar50 * 4) =
               (ABS(auVar97._4_4_) * 4.7683716e-07 + auVar97._4_4_) - fVar99;
          *(float *)(uVar38 + 0xd0 + (long)pDVar50 * 4) =
               (ABS(auVar97._8_4_) * 4.7683716e-07 + auVar97._8_4_) - fVar100;
          pDVar50 = (Device *)((long)&(pDVar50->super_State).super_RefCount._vptr_RefCount + 1);
          pfVar33 = pfVar33 + 0x18;
        } while (local_848 != pDVar50);
      }
    }
    else if (local_848 != (Device *)0x0) {
      uVar38 = (ulong)pcVar37 & 0xfffffffffffffff0;
      pfVar33 = &values[0].dt.upper;
      pDVar50 = (Device *)0x0;
      do {
        *(undefined8 *)(uVar38 + (long)pDVar50 * 8) = *(undefined8 *)(pfVar33 + -0x15);
        fVar95 = *pfVar33;
        fVar89 = ((BBox1f *)(pfVar33 + -1))->lower;
        fVar101 = 1.0 / (fVar95 - fVar89);
        fVar99 = -fVar89 * fVar101;
        fVar94 = 1.0 - fVar99;
        auVar97._0_4_ = pfVar33[-0x11] * fVar94 + pfVar33[-9] * fVar99;
        auVar97._4_4_ = pfVar33[-0x10] * fVar94 + pfVar33[-8] * fVar99;
        auVar97._8_4_ = pfVar33[-0xf] * fVar94 + pfVar33[-7] * fVar99;
        auVar97._12_4_ = pfVar33[-0xe] * fVar94 + pfVar33[-6] * fVar99;
        auVar104._0_4_ = fVar94 * pfVar33[-0xd] + fVar99 * pfVar33[-5];
        auVar104._4_4_ = fVar94 * pfVar33[-0xc] + fVar99 * pfVar33[-4];
        auVar104._8_4_ = fVar94 * pfVar33[-0xb] + fVar99 * pfVar33[-3];
        auVar104._12_4_ = fVar94 * pfVar33[-10] + fVar99 * pfVar33[-2];
        fVar101 = (1.0 - fVar89) * fVar101;
        fVar94 = 1.0 - fVar101;
        auVar107._0_4_ = pfVar33[-0x11] * fVar94 + pfVar33[-9] * fVar101;
        auVar107._4_4_ = pfVar33[-0x10] * fVar94 + pfVar33[-8] * fVar101;
        auVar107._8_4_ = pfVar33[-0xf] * fVar94 + pfVar33[-7] * fVar101;
        auVar107._12_4_ = pfVar33[-0xe] * fVar94 + pfVar33[-6] * fVar101;
        auVar106._0_4_ = fVar94 * pfVar33[-0xd] + fVar101 * pfVar33[-5];
        auVar106._4_4_ = fVar94 * pfVar33[-0xc] + fVar101 * pfVar33[-4];
        auVar106._8_4_ = fVar94 * pfVar33[-0xb] + fVar101 * pfVar33[-3];
        auVar106._12_4_ = fVar94 * pfVar33[-10] + fVar101 * pfVar33[-2];
        auVar88 = minps(auVar97,_DAT_01f80810);
        auVar91 = maxps(auVar104,auVar73);
        auVar84 = minps(auVar107,_DAT_01f80810);
        auVar107 = maxps(auVar106,auVar73);
        fVar100 = auVar88._0_4_ - ABS(auVar88._0_4_) * 4.7683716e-07;
        fVar102 = auVar88._4_4_ - ABS(auVar88._4_4_) * 4.7683716e-07;
        fVar103 = auVar88._8_4_ - ABS(auVar88._8_4_) * 4.7683716e-07;
        fVar94 = ABS(auVar91._0_4_) * 4.7683716e-07 + auVar91._0_4_;
        fVar101 = ABS(auVar91._4_4_) * 4.7683716e-07 + auVar91._4_4_;
        fVar99 = ABS(auVar91._8_4_) * 4.7683716e-07 + auVar91._8_4_;
        *(float *)(uVar38 + 0x20 + (long)pDVar50 * 4) = fVar100;
        *(float *)(uVar38 + 0x40 + (long)pDVar50 * 4) = fVar102;
        *(float *)(uVar38 + 0x60 + (long)pDVar50 * 4) = fVar103;
        *(float *)(uVar38 + 0x30 + (long)pDVar50 * 4) = fVar94;
        *(float *)(uVar38 + 0x50 + (long)pDVar50 * 4) = fVar101;
        *(float *)(uVar38 + 0x70 + (long)pDVar50 * 4) = fVar99;
        *(float *)(uVar38 + 0x80 + (long)pDVar50 * 4) =
             (auVar84._0_4_ - ABS(auVar84._0_4_) * 4.7683716e-07) - fVar100;
        *(float *)(uVar38 + 0xa0 + (long)pDVar50 * 4) =
             (auVar84._4_4_ - ABS(auVar84._4_4_) * 4.7683716e-07) - fVar102;
        *(float *)(uVar38 + 0xc0 + (long)pDVar50 * 4) =
             (auVar84._8_4_ - ABS(auVar84._8_4_) * 4.7683716e-07) - fVar103;
        *(float *)(uVar38 + 0x90 + (long)pDVar50 * 4) =
             (ABS(auVar107._0_4_) * 4.7683716e-07 + auVar107._0_4_) - fVar94;
        *(float *)(uVar38 + 0xb0 + (long)pDVar50 * 4) =
             (ABS(auVar107._4_4_) * 4.7683716e-07 + auVar107._4_4_) - fVar101;
        *(float *)(uVar38 + 0xd0 + (long)pDVar50 * 4) =
             (ABS(auVar107._8_4_) * 4.7683716e-07 + auVar107._8_4_) - fVar99;
        *(float *)(uVar38 + 0xe0 + (long)pDVar50 * 4) = fVar89;
        *(uint *)(uVar38 + 0xf0 + (long)pDVar50 * 4) =
             ~-(uint)(fVar95 == 1.0) & (uint)fVar95 | -(uint)(fVar95 == 1.0) & 0x3f800001;
        pDVar50 = (Device *)((long)&(pDVar50->super_State).super_RefCount._vptr_RefCount + 1);
        pfVar33 = pfVar33 + 0x18;
      } while (local_848 != pDVar50);
    }
    uVar38 = (ulong)(uint)local_1ea8._0_4_;
    sVar55 = local_1ec8._0_8_;
    sVar58 = local_1ec8._8_8_;
  }
  uVar20 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar19 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar38 == '\0') {
    *(ulong *)local_1e60._M_allocated_capacity = uVar51 | (ulong)pcVar37;
    *(undefined8 *)&(((LBBox3fa *)(local_1e60._M_allocated_capacity + 0x10))->bounds0).lower.field_0
         = local_1e78._0_8_;
    *(undefined8 *)(local_1e60._M_allocated_capacity + 0x18) = local_1e78._8_8_;
    *(undefined1 (*) [8])&((Vec3fa *)(local_1e60._M_allocated_capacity + 0x20))->field_0 =
         local_1e98;
    *(pointer *)(local_1e60._M_allocated_capacity + 0x28) = _Stack_1e90._M_p;
    *(size_type *)
     &(((BBox<embree::Vec3fa> *)(local_1e60._M_allocated_capacity + 0x30))->lower).field_0 = sVar55;
    *(size_type *)(local_1e60._M_allocated_capacity + 0x38) = sVar58;
    local_1d38._0_8_ = local_1ed8;
    local_1d38._8_8_ = uStack_1ed0;
  }
  else {
    vprimID.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vprimID.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    va1.field_0._0_8_ = 0x7f8000007f800000;
    va1.field_0._8_8_ = 0x7f8000007f800000;
    va1.field_0._16_8_ = 0xff800000ff800000;
    va1.field_0._24_8_ = 0xff800000ff800000;
    va1.field_0._32_8_ = 0x7f8000007f800000;
    va1.field_0._40_8_ = 0x7f8000007f800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      vc0.field_0._0_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      vc0.field_0._8_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vb1,(anon_class_16_2_aeee9775 *)&vprimID,(range<unsigned_long> *)&vc0)
      ;
    }
    else {
      vc0.field_0._12_2_ = 0x401;
      vc0.field_0._32_4_ = 0;
      vc0.field_0._36_4_ = 0;
      vc0.field_0._40_4_ = 0;
      vc0.field_0._44_4_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&vc0);
      vc1.field_0._0_8_ = uVar20;
      vc1.field_0._8_8_ = uVar19;
      vc1.field_0._16_8_ = 0x400;
      vgeomID.field_0.v[0] = (longlong)&vSplitMask;
      vgeomID.field_0.v[1] = (longlong)&vprimID;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vb1,(d1 *)&vc1,(blocked_range<unsigned_long> *)&va1,
                 (LBBox<embree::Vec3fa> *)&vgeomID,
                 (anon_class_16_2_ed117de8_conflict31 *)vgeomID.field_0.v[0],
                 (anon_class_1_0_00000001 *)&vc0,(task_group_context *)this);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vc0);
      if (cVar22 != '\0') {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"task cancelled");
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vc0);
    }
    *(ulong *)local_1e60._M_allocated_capacity = uVar51 | (ulong)pcVar37;
    *(undefined8 *)&(((LBBox3fa *)(local_1e60._M_allocated_capacity + 0x10))->bounds0).lower.field_0
         = vb1.field_0._0_8_;
    *(undefined8 *)(local_1e60._M_allocated_capacity + 0x18) = vb1.field_0._8_8_;
    *(undefined8 *)&((Vec3fa *)(local_1e60._M_allocated_capacity + 0x20))->field_0 =
         vb1.field_0._16_8_;
    *(undefined8 *)(local_1e60._M_allocated_capacity + 0x28) = vb1.field_0._24_8_;
    *(undefined8 *)
     &(((BBox<embree::Vec3fa> *)(local_1e60._M_allocated_capacity + 0x30))->lower).field_0 =
         vb1.field_0._32_8_;
    *(undefined8 *)(local_1e60._M_allocated_capacity + 0x38) = vb1.field_0._40_8_;
  }
  *(undefined8 *)&((Vec3fa *)(local_1e60._M_allocated_capacity + 0x40))->field_0 = local_1d38._0_8_;
  *(undefined8 *)(local_1e60._M_allocated_capacity + 0x48) = local_1d38._8_8_;
  *(BBox1f *)(local_1e60._M_allocated_capacity + 0x50) =
       current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == (Device *)0x0) {
    return (NodeRecordMB4D *)local_1e60._0_8_;
  }
  pDVar50 = (Device *)0x0;
  do {
    pFVar7 = local_8c8[(long)pDVar50];
    psVar1 = &pFVar7->slotMask;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pDVar30 = pFVar7->device;
      if (pDVar30 != (Device *)0x0) {
        sVar55 = (pDVar30->super_State).tri_accel._M_string_length;
        pvVar25 = (void *)(pDVar30->super_State).tri_accel.field_2._M_allocated_capacity;
        if (pvVar25 != (void *)0x0) {
          if (sVar55 * 0x50 < 0x1c00000) {
            alignedFree(pvVar25);
          }
          else {
            os_free(pvVar25,sVar55 * 0x50,
                    SUB81((pDVar30->super_State).super_RefCount.refCounter.
                          super___atomic_base<unsigned_long>._M_i,0));
          }
        }
        if (sVar55 != 0) {
          pp_Var10 = (pDVar30->super_State).super_RefCount._vptr_RefCount;
          (**(code **)*pp_Var10)(pp_Var10,sVar55 * -0x50,1);
        }
        (pDVar30->super_State).tri_accel._M_dataplus._M_p = (pointer)0x0;
        (pDVar30->super_State).tri_accel._M_string_length = 0;
        (pDVar30->super_State).tri_accel.field_2._M_allocated_capacity = 0;
      }
      operator_delete(pDVar30);
    }
    pDVar50 = (Device *)((long)&(pDVar50->super_State).super_RefCount._vptr_RefCount + 1);
  } while (pDVar50 < local_848);
  return (NodeRecordMB4D *)local_1e60._0_8_;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }